

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  Primitive PVar11;
  int iVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  undefined1 auVar81 [28];
  byte bVar82;
  undefined1 auVar83 [32];
  bool bVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  Geometry *pGVar89;
  Geometry *geometry;
  long lVar90;
  ulong uVar91;
  undefined4 uVar92;
  undefined8 uVar93;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar94 [16];
  float fVar109;
  float fVar111;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar98 [16];
  undefined1 auVar108 [32];
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar118 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [32];
  undefined1 auVar133 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vint4 ai_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar187 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined4 uVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  float fVar207;
  float fVar209;
  undefined1 auVar208 [32];
  float fVar210;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar213 [32];
  float fVar218;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  RTCFilterFunctionNArguments args;
  ulong local_840;
  undefined1 local_820 [16];
  undefined1 local_800 [32];
  undefined1 local_720 [16];
  ulong local_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 (*local_638) [16];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  ulong local_5c0;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  LinearSpace3fa *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  int iStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370 [16];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar181 [16];
  
  PVar11 = prim[1];
  uVar91 = (ulong)(byte)PVar11;
  fVar129 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  auVar94._0_4_ = fVar129 * auVar14._0_4_;
  auVar94._4_4_ = fVar129 * auVar14._4_4_;
  auVar94._8_4_ = fVar129 * auVar14._8_4_;
  auVar94._12_4_ = fVar129 * auVar14._12_4_;
  auVar155._0_4_ = fVar129 * auVar15._0_4_;
  auVar155._4_4_ = fVar129 * auVar15._4_4_;
  auVar155._8_4_ = fVar129 * auVar15._8_4_;
  auVar155._12_4_ = fVar129 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar11 * 0xc + uVar91 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar86 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar91 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar86 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar211._4_4_ = auVar155._0_4_;
  auVar211._0_4_ = auVar155._0_4_;
  auVar211._8_4_ = auVar155._0_4_;
  auVar211._12_4_ = auVar155._0_4_;
  auVar116 = vshufps_avx(auVar155,auVar155,0x55);
  auVar95 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar129 = auVar95._0_4_;
  auVar197._0_4_ = fVar129 * auVar16._0_4_;
  fVar109 = auVar95._4_4_;
  auVar197._4_4_ = fVar109 * auVar16._4_4_;
  fVar110 = auVar95._8_4_;
  auVar197._8_4_ = fVar110 * auVar16._8_4_;
  fVar111 = auVar95._12_4_;
  auVar197._12_4_ = fVar111 * auVar16._12_4_;
  auVar191._0_4_ = auVar19._0_4_ * fVar129;
  auVar191._4_4_ = auVar19._4_4_ * fVar109;
  auVar191._8_4_ = auVar19._8_4_ * fVar110;
  auVar191._12_4_ = auVar19._12_4_ * fVar111;
  auVar174._0_4_ = auVar130._0_4_ * fVar129;
  auVar174._4_4_ = auVar130._4_4_ * fVar109;
  auVar174._8_4_ = auVar130._8_4_ * fVar110;
  auVar174._12_4_ = auVar130._12_4_ * fVar111;
  auVar95 = vfmadd231ps_fma(auVar197,auVar116,auVar15);
  auVar117 = vfmadd231ps_fma(auVar191,auVar116,auVar18);
  auVar116 = vfmadd231ps_fma(auVar174,auVar96,auVar116);
  auVar142 = vfmadd231ps_fma(auVar95,auVar211,auVar14);
  auVar200 = ZEXT1664(auVar142);
  auVar117 = vfmadd231ps_fma(auVar117,auVar211,auVar17);
  auVar148 = vfmadd231ps_fma(auVar116,auVar97,auVar211);
  auVar212._4_4_ = auVar94._0_4_;
  auVar212._0_4_ = auVar94._0_4_;
  auVar212._8_4_ = auVar94._0_4_;
  auVar212._12_4_ = auVar94._0_4_;
  auVar116 = vshufps_avx(auVar94,auVar94,0x55);
  auVar95 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar129 = auVar95._0_4_;
  auVar156._0_4_ = fVar129 * auVar16._0_4_;
  fVar109 = auVar95._4_4_;
  auVar156._4_4_ = fVar109 * auVar16._4_4_;
  fVar110 = auVar95._8_4_;
  auVar156._8_4_ = fVar110 * auVar16._8_4_;
  fVar111 = auVar95._12_4_;
  auVar156._12_4_ = fVar111 * auVar16._12_4_;
  auVar115._0_4_ = auVar19._0_4_ * fVar129;
  auVar115._4_4_ = auVar19._4_4_ * fVar109;
  auVar115._8_4_ = auVar19._8_4_ * fVar110;
  auVar115._12_4_ = auVar19._12_4_ * fVar111;
  auVar95._0_4_ = auVar130._0_4_ * fVar129;
  auVar95._4_4_ = auVar130._4_4_ * fVar109;
  auVar95._8_4_ = auVar130._8_4_ * fVar110;
  auVar95._12_4_ = auVar130._12_4_ * fVar111;
  auVar15 = vfmadd231ps_fma(auVar156,auVar116,auVar15);
  auVar16 = vfmadd231ps_fma(auVar115,auVar116,auVar18);
  auVar18 = vfmadd231ps_fma(auVar95,auVar116,auVar96);
  auVar19 = vfmadd231ps_fma(auVar15,auVar212,auVar14);
  auVar96 = vfmadd231ps_fma(auVar16,auVar212,auVar17);
  auVar130 = vfmadd231ps_fma(auVar18,auVar212,auVar97);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar142,local_290);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar147,1);
  auVar15 = vblendvps_avx(auVar142,auVar147,auVar14);
  auVar14 = vandps_avx(auVar117,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar147,1);
  auVar16 = vblendvps_avx(auVar117,auVar147,auVar14);
  auVar14 = vandps_avx(auVar148,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar147,1);
  auVar14 = vblendvps_avx(auVar148,auVar147,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar170);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar170);
  auVar18 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar170);
  auVar97 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar148._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar148._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar148._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar148._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar157._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar157._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar157._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar157._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar117._1_3_ = 0;
  auVar117[0] = PVar11;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar91 * -2 + 6);
  auVar14 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar96);
  auVar175._0_4_ = auVar14._0_4_ * auVar18._0_4_;
  auVar175._4_4_ = auVar14._4_4_ * auVar18._4_4_;
  auVar175._8_4_ = auVar14._8_4_ * auVar18._8_4_;
  auVar175._12_4_ = auVar14._12_4_ * auVar18._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar14 = vsubps_avx(auVar14,auVar96);
  auVar116._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar116._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar116._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar116._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar86 + uVar91 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar130);
  auVar142._0_4_ = auVar97._0_4_ * auVar14._0_4_;
  auVar142._4_4_ = auVar97._4_4_ * auVar14._4_4_;
  auVar142._8_4_ = auVar97._8_4_ * auVar14._8_4_;
  auVar142._12_4_ = auVar97._12_4_ * auVar14._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar130);
  auVar96._0_4_ = auVar97._0_4_ * auVar14._0_4_;
  auVar96._4_4_ = auVar97._4_4_ * auVar14._4_4_;
  auVar96._8_4_ = auVar97._8_4_ * auVar14._8_4_;
  auVar96._12_4_ = auVar97._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar148,auVar157);
  auVar15 = vpminsd_avx(auVar175,auVar116);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar142,auVar96);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar181._4_4_ = uVar92;
  auVar181._0_4_ = uVar92;
  auVar181._8_4_ = uVar92;
  auVar181._12_4_ = uVar92;
  auVar187 = ZEXT1664(auVar181);
  auVar15 = vmaxps_avx(auVar15,auVar181);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_2a0._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar148,auVar157);
  auVar15 = vpmaxsd_avx(auVar175,auVar116);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar142,auVar96);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar130._4_4_ = uVar92;
  auVar130._0_4_ = uVar92;
  auVar130._8_4_ = uVar92;
  auVar130._12_4_ = uVar92;
  auVar15 = vminps_avx(auVar15,auVar130);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar97._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar117[4] = PVar11;
  auVar117._5_3_ = 0;
  auVar117[8] = PVar11;
  auVar117._9_3_ = 0;
  auVar117[0xc] = PVar11;
  auVar117._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar117,_DAT_01f7fcf0);
  auVar14 = vcmpps_avx(local_2a0,auVar97,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar85 = vmovmskps_avx(auVar14);
  if (uVar85 == 0) {
    bVar84 = false;
  }
  else {
    uVar85 = uVar85 & 0xff;
    local_548 = pre->ray_space + k;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_638 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar146 = local_420;
      auVar199 = auVar200._0_32_;
      lVar23 = 0;
      uVar91 = (ulong)uVar85;
      for (uVar86 = uVar91; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_820._4_4_ = *(undefined4 *)(prim + 2);
      local_708 = (ulong)(uint)local_820._4_4_;
      local_600._4_4_ = *(undefined4 *)(prim + lVar23 * 4 + 6);
      local_5c0 = (ulong)(uint)local_600._4_4_;
      pGVar89 = (context->scene->geometries).items[local_708].ptr;
      uVar86 = (ulong)*(uint *)(*(long *)&pGVar89->field_0x58 +
                               pGVar89[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_5c0);
      p_Var13 = pGVar89[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar89[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var13 * uVar86);
      local_690 = *(undefined8 *)*pauVar1;
      uStack_688 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar86 + 1) * (long)p_Var13);
      local_6a0 = *(undefined8 *)*pauVar2;
      uStack_698 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar86 + 2) * (long)p_Var13);
      local_6b0 = *(undefined8 *)*pauVar3;
      uStack_6a8 = *(undefined8 *)(*pauVar3 + 8);
      uVar91 = uVar91 - 1 & uVar91;
      pauVar4 = (undefined1 (*) [12])(lVar23 + (uVar86 + 3) * (long)p_Var13);
      local_5b0 = (float)*(undefined8 *)*pauVar4;
      fStack_5ac = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_5a8 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_5a4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar91 != 0) {
        uVar87 = uVar91 - 1 & uVar91;
        for (uVar86 = uVar91; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar89[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar17 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar15 = vsubps_avx(*pauVar1,auVar17);
      uVar92 = auVar15._0_4_;
      auVar149._4_4_ = uVar92;
      auVar149._0_4_ = uVar92;
      auVar149._8_4_ = uVar92;
      auVar149._12_4_ = uVar92;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar9 = (local_548->vx).field_0;
      aVar10 = (local_548->vy).field_0;
      fVar129 = (local_548->vz).field_0.m128[0];
      fVar109 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar110 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar111 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar164._0_4_ = fVar129 * auVar15._0_4_;
      auVar164._4_4_ = fVar109 * auVar15._4_4_;
      auVar164._8_4_ = fVar110 * auVar15._8_4_;
      auVar164._12_4_ = fVar111 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar10,auVar14);
      auVar19 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar9,auVar149);
      auVar14 = vblendps_avx(auVar19,*pauVar1,8);
      auVar16 = vsubps_avx(*pauVar2,auVar17);
      uVar92 = auVar16._0_4_;
      auVar165._4_4_ = uVar92;
      auVar165._0_4_ = uVar92;
      auVar165._8_4_ = uVar92;
      auVar165._12_4_ = uVar92;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar192._0_4_ = fVar129 * auVar16._0_4_;
      auVar192._4_4_ = fVar109 * auVar16._4_4_;
      auVar192._8_4_ = fVar110 * auVar16._8_4_;
      auVar192._12_4_ = fVar111 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar10,auVar15);
      auVar97 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar9,auVar165);
      auVar15 = vblendps_avx(auVar97,*pauVar2,8);
      auVar18 = vsubps_avx(*pauVar3,auVar17);
      uVar92 = auVar18._0_4_;
      auVar171._4_4_ = uVar92;
      auVar171._0_4_ = uVar92;
      auVar171._8_4_ = uVar92;
      auVar171._12_4_ = uVar92;
      auVar16 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar198._0_4_ = fVar129 * auVar18._0_4_;
      auVar198._4_4_ = fVar109 * auVar18._4_4_;
      auVar198._8_4_ = fVar110 * auVar18._8_4_;
      auVar198._12_4_ = fVar111 * auVar18._12_4_;
      auVar16 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar10,auVar16);
      auVar96 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar9,auVar171);
      auVar16 = vblendps_avx(auVar96,*pauVar3,8);
      auVar77._12_4_ = fStack_5a4;
      auVar77._0_12_ = *pauVar4;
      auVar18 = vsubps_avx(auVar77,auVar17);
      uVar92 = auVar18._0_4_;
      auVar172._4_4_ = uVar92;
      auVar172._0_4_ = uVar92;
      auVar172._8_4_ = uVar92;
      auVar172._12_4_ = uVar92;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar202._0_4_ = fVar129 * auVar18._0_4_;
      auVar202._4_4_ = fVar109 * auVar18._4_4_;
      auVar202._8_4_ = fVar110 * auVar18._8_4_;
      auVar202._12_4_ = fVar111 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar10,auVar17);
      auVar130 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar9,auVar172);
      auVar17 = vblendps_avx(auVar130,auVar77,8);
      auVar14 = vandps_avx(auVar14,local_290);
      auVar15 = vandps_avx(auVar15,local_290);
      auVar18 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vandps_avx(auVar16,local_290);
      auVar15 = vandps_avx(auVar17,local_290);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar18,auVar14);
      auVar15 = vmovshdup_avx(auVar14);
      auVar15 = vmaxss_avx(auVar15,auVar14);
      auVar14 = vshufpd_avx(auVar14,auVar14,1);
      auVar14 = vmaxss_avx(auVar14,auVar15);
      lVar23 = (long)iVar12 * 0x44;
      auVar15 = vmovshdup_avx(auVar19);
      uVar93 = auVar15._0_8_;
      local_500._8_8_ = uVar93;
      local_500._0_8_ = uVar93;
      local_500._16_8_ = uVar93;
      local_500._24_8_ = uVar93;
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      auVar15 = vmovshdup_avx(auVar97);
      uVar93 = auVar15._0_8_;
      auVar143._8_8_ = uVar93;
      auVar143._0_8_ = uVar93;
      auVar143._16_8_ = uVar93;
      auVar143._24_8_ = uVar93;
      auVar140 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      uVar196 = auVar96._0_4_;
      auVar137._4_4_ = uVar196;
      auVar137._0_4_ = uVar196;
      auVar137._8_4_ = uVar196;
      auVar137._12_4_ = uVar196;
      auVar137._16_4_ = uVar196;
      auVar137._20_4_ = uVar196;
      auVar137._24_4_ = uVar196;
      auVar137._28_4_ = uVar196;
      auVar15 = vmovshdup_avx(auVar96);
      uVar93 = auVar15._0_8_;
      auVar158._8_8_ = uVar93;
      auVar158._0_8_ = uVar93;
      auVar158._16_8_ = uVar93;
      auVar158._24_8_ = uVar93;
      fVar109 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar110 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fVar111 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fVar112 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fVar113 = *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      fVar114 = *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      fVar173 = *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar80 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar201 = auVar130._0_4_;
      auVar16 = vmovshdup_avx(auVar130);
      local_660 = auVar16._0_8_;
      auVar166._0_4_ = fVar109 * fVar201;
      auVar166._4_4_ = fVar110 * fVar201;
      auVar166._8_4_ = fVar111 * fVar201;
      auVar166._12_4_ = fVar112 * fVar201;
      auVar166._16_4_ = fVar113 * fVar201;
      auVar166._20_4_ = fVar114 * fVar201;
      auVar166._24_4_ = fVar173 * fVar201;
      auVar166._28_4_ = 0;
      fVar207 = auVar16._0_4_;
      auVar99._0_4_ = fVar207 * fVar109;
      fVar209 = auVar16._4_4_;
      auVar99._4_4_ = fVar209 * fVar110;
      auVar99._8_4_ = fVar207 * fVar111;
      auVar99._12_4_ = fVar209 * fVar112;
      auVar99._16_4_ = fVar207 * fVar113;
      auVar99._20_4_ = fVar209 * fVar114;
      auVar99._24_4_ = fVar207 * fVar173;
      auVar99._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar166,auVar140,auVar137);
      auVar17 = vfmadd231ps_fma(auVar99,auVar140,auVar158);
      uVar92 = auVar97._0_4_;
      local_6e0._4_4_ = uVar92;
      local_6e0._0_4_ = uVar92;
      local_6e0._8_4_ = uVar92;
      local_6e0._12_4_ = uVar92;
      local_6e0._16_4_ = uVar92;
      local_6e0._20_4_ = uVar92;
      local_6e0._24_4_ = uVar92;
      local_6e0._28_4_ = uVar92;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar107,local_6e0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,auVar143);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      uVar92 = auVar19._0_4_;
      auVar213._4_4_ = uVar92;
      auVar213._0_4_ = uVar92;
      auVar213._8_4_ = uVar92;
      auVar213._12_4_ = uVar92;
      auVar213._16_4_ = uVar92;
      auVar213._20_4_ = uVar92;
      auVar213._24_4_ = uVar92;
      auVar213._28_4_ = uVar92;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar99,auVar213);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar99,local_500);
      auVar166 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      pauVar5 = (undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar178 = *(float *)*pauVar5;
      fVar179 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar180 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar188 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar189 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar190 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar70 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      auVar81 = *(undefined1 (*) [28])*pauVar5;
      auVar186._4_4_ = fVar201 * fVar179;
      auVar186._0_4_ = fVar201 * fVar178;
      auVar186._8_4_ = fVar201 * fVar180;
      auVar186._12_4_ = fVar201 * fVar188;
      auVar186._16_4_ = fVar201 * fVar189;
      auVar186._20_4_ = fVar201 * fVar190;
      auVar186._24_4_ = fVar201 * fVar70;
      auVar186._28_4_ = fVar201;
      auVar18 = vfmadd231ps_fma(auVar186,auVar166,auVar137);
      auVar160._4_4_ = fVar209 * fVar179;
      auVar160._0_4_ = fVar207 * fVar178;
      auVar160._8_4_ = fVar207 * fVar180;
      auVar160._12_4_ = fVar209 * fVar188;
      auVar160._16_4_ = fVar207 * fVar189;
      auVar160._20_4_ = fVar209 * fVar190;
      auVar160._24_4_ = fVar207 * fVar70;
      auVar160._28_4_ = uVar196;
      auVar116 = vfmadd231ps_fma(auVar160,auVar166,auVar158);
      auVar186 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar186,local_6e0);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar186,auVar143);
      auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar160,auVar213);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar160,local_500);
      auVar120 = ZEXT1632(auVar18);
      local_4c0 = ZEXT1632(auVar16);
      auVar208 = vsubps_avx(auVar120,local_4c0);
      local_2e0 = ZEXT1632(auVar116);
      auVar100 = ZEXT1632(auVar17);
      auVar182 = vsubps_avx(local_2e0,auVar100);
      auVar101._0_4_ = auVar208._0_4_ * auVar17._0_4_;
      auVar101._4_4_ = auVar208._4_4_ * auVar17._4_4_;
      auVar101._8_4_ = auVar208._8_4_ * auVar17._8_4_;
      auVar101._12_4_ = auVar208._12_4_ * auVar17._12_4_;
      auVar101._16_4_ = auVar208._16_4_ * 0.0;
      auVar101._20_4_ = auVar208._20_4_ * 0.0;
      auVar101._24_4_ = auVar208._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      fVar210 = auVar182._0_4_;
      auVar121._0_4_ = fVar210 * auVar16._0_4_;
      fVar216 = auVar182._4_4_;
      auVar121._4_4_ = fVar216 * auVar16._4_4_;
      fVar217 = auVar182._8_4_;
      auVar121._8_4_ = fVar217 * auVar16._8_4_;
      fVar218 = auVar182._12_4_;
      auVar121._12_4_ = fVar218 * auVar16._12_4_;
      fVar219 = auVar182._16_4_;
      auVar121._16_4_ = fVar219 * 0.0;
      fVar220 = auVar182._20_4_;
      auVar121._20_4_ = fVar220 * 0.0;
      fVar221 = auVar182._24_4_;
      auVar121._24_4_ = fVar221 * 0.0;
      auVar121._28_4_ = 0;
      auVar101 = vsubps_avx(auVar101,auVar121);
      auVar16 = vpermilps_avx(*pauVar1,0xff);
      uVar93 = auVar16._0_8_;
      local_80._8_8_ = uVar93;
      local_80._0_8_ = uVar93;
      local_80._16_8_ = uVar93;
      local_80._24_8_ = uVar93;
      auVar17 = vpermilps_avx(*pauVar2,0xff);
      uVar93 = auVar17._0_8_;
      local_a0._8_8_ = uVar93;
      local_a0._0_8_ = uVar93;
      local_a0._16_8_ = uVar93;
      local_a0._24_8_ = uVar93;
      auVar17 = vpermilps_avx(*pauVar3,0xff);
      uVar93 = auVar17._0_8_;
      local_c0._8_8_ = uVar93;
      local_c0._0_8_ = uVar93;
      local_c0._16_8_ = uVar93;
      local_c0._24_8_ = uVar93;
      auVar78._12_4_ = fStack_5a4;
      auVar78._0_12_ = *pauVar4;
      auVar17 = vpermilps_avx(auVar78,0xff);
      local_e0 = auVar17._0_8_;
      fVar129 = auVar17._0_4_;
      auVar167._0_4_ = fVar109 * fVar129;
      fVar109 = auVar17._4_4_;
      auVar167._4_4_ = fVar110 * fVar109;
      auVar167._8_4_ = fVar111 * fVar129;
      auVar167._12_4_ = fVar112 * fVar109;
      auVar167._16_4_ = fVar113 * fVar129;
      auVar167._20_4_ = fVar114 * fVar109;
      auVar167._24_4_ = fVar173 * fVar129;
      auVar167._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar167,local_c0,auVar140);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_a0,auVar107);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar99,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar108._4_4_ = fVar109 * fVar179;
      auVar108._0_4_ = fVar129 * fVar178;
      auVar108._8_4_ = fVar129 * fVar180;
      auVar108._12_4_ = fVar109 * fVar188;
      auVar108._16_4_ = fVar129 * fVar189;
      auVar108._20_4_ = fVar109 * fVar190;
      auVar108._24_4_ = fVar129 * fVar70;
      auVar108._28_4_ = auVar99._28_4_;
      auVar17 = vfmadd231ps_fma(auVar108,auVar166,local_c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar186,local_a0);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,local_80);
      auVar20._4_4_ = fVar216 * fVar216;
      auVar20._0_4_ = fVar210 * fVar210;
      auVar20._8_4_ = fVar217 * fVar217;
      auVar20._12_4_ = fVar218 * fVar218;
      auVar20._16_4_ = fVar219 * fVar219;
      auVar20._20_4_ = fVar220 * fVar220;
      auVar20._24_4_ = fVar221 * fVar221;
      auVar20._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar20,auVar208,auVar208);
      auVar108 = vmaxps_avx(ZEXT1632(auVar116),ZEXT1632(auVar95));
      auVar21._4_4_ = auVar108._4_4_ * auVar108._4_4_ * auVar16._4_4_;
      auVar21._0_4_ = auVar108._0_4_ * auVar108._0_4_ * auVar16._0_4_;
      auVar21._8_4_ = auVar108._8_4_ * auVar108._8_4_ * auVar16._8_4_;
      auVar21._12_4_ = auVar108._12_4_ * auVar108._12_4_ * auVar16._12_4_;
      auVar21._16_4_ = auVar108._16_4_ * auVar108._16_4_ * 0.0;
      auVar21._20_4_ = auVar108._20_4_ * auVar108._20_4_ * 0.0;
      auVar21._24_4_ = auVar108._24_4_ * auVar108._24_4_ * 0.0;
      auVar21._28_4_ = auVar108._28_4_;
      auVar22._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar22._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar22._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar22._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar22._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar22._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar22._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar22._28_4_ = auVar101._28_4_;
      auVar108 = vcmpps_avx(auVar22,auVar21,2);
      fVar129 = auVar14._0_4_ * 4.7683716e-07;
      auVar102._0_4_ = (float)iVar12;
      local_420._4_12_ = auVar96._4_12_;
      local_420._0_4_ = auVar102._0_4_;
      local_420._16_16_ = auVar146._16_16_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar102._16_4_ = auVar102._0_4_;
      auVar102._20_4_ = auVar102._0_4_;
      auVar102._24_4_ = auVar102._0_4_;
      auVar102._28_4_ = auVar102._0_4_;
      auVar146 = vcmpps_avx(_DAT_01faff40,auVar102,1);
      auVar16 = vpermilps_avx(auVar19,0xaa);
      uVar93 = auVar16._0_8_;
      local_480._8_8_ = uVar93;
      local_480._0_8_ = uVar93;
      local_480._16_8_ = uVar93;
      local_480._24_8_ = uVar93;
      auVar17 = vpermilps_avx(auVar97,0xaa);
      uVar93 = auVar17._0_8_;
      local_460._8_8_ = uVar93;
      local_460._0_8_ = uVar93;
      local_460._16_8_ = uVar93;
      local_460._24_8_ = uVar93;
      auVar14 = vshufps_avx(auVar96,auVar96,0xaa);
      uVar93 = auVar14._0_8_;
      local_280._8_8_ = uVar93;
      local_280._0_8_ = uVar93;
      local_280._16_8_ = uVar93;
      local_280._24_8_ = uVar93;
      auVar14 = vshufps_avx(auVar130,auVar130,0xaa);
      uVar93 = auVar14._0_8_;
      register0x00001508 = uVar93;
      local_5a0 = uVar93;
      register0x00001510 = uVar93;
      register0x00001518 = uVar93;
      auVar101 = auVar146 & auVar108;
      uVar85 = *(uint *)(ray + k * 4 + 0x30);
      local_520._0_16_ = ZEXT416(uVar85);
      local_680._0_16_ = ZEXT416((uint)fVar129);
      uStack_658 = local_660;
      uStack_650 = local_660;
      uStack_648 = local_660;
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0x7f,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0xbf,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar101[0x1f]) {
        auVar200 = ZEXT3264(auVar199);
LAB_0161acc6:
        auVar206 = ZEXT3264(_local_5a0);
        bVar84 = false;
        auVar177 = ZEXT3264(local_6e0);
      }
      else {
        local_300 = vandps_avx(auVar108,auVar146);
        local_400._0_4_ = auVar81._0_4_;
        local_400._4_4_ = auVar81._4_4_;
        fStack_3f8 = auVar81._8_4_;
        fStack_3f4 = auVar81._12_4_;
        fStack_3f0 = auVar81._16_4_;
        fStack_3ec = auVar81._20_4_;
        fStack_3e8 = auVar81._24_4_;
        fVar178 = auVar14._0_4_;
        fVar179 = auVar14._4_4_;
        auVar146._4_4_ = fVar179 * (float)local_400._4_4_;
        auVar146._0_4_ = fVar178 * (float)local_400._0_4_;
        auVar146._8_4_ = fVar178 * fStack_3f8;
        auVar146._12_4_ = fVar179 * fStack_3f4;
        auVar146._16_4_ = fVar178 * fStack_3f0;
        auVar146._20_4_ = fVar179 * fStack_3ec;
        auVar146._24_4_ = fVar178 * fStack_3e8;
        auVar146._28_4_ = local_300._28_4_;
        auVar14 = vfmadd213ps_fma(auVar166,local_280,auVar146);
        auVar14 = vfmadd213ps_fma(auVar186,local_460,ZEXT1632(auVar14));
        auVar14 = vfmadd213ps_fma(auVar160,local_480,ZEXT1632(auVar14));
        local_4e0._0_4_ = auVar80._0_4_;
        local_4e0._4_4_ = auVar80._4_4_;
        fStack_4d8 = auVar80._8_4_;
        fStack_4d4 = auVar80._12_4_;
        fStack_4d0 = auVar80._16_4_;
        fStack_4cc = auVar80._20_4_;
        fStack_4c8 = auVar80._24_4_;
        auVar103._0_4_ = fVar178 * (float)local_4e0._0_4_;
        auVar103._4_4_ = fVar179 * (float)local_4e0._4_4_;
        auVar103._8_4_ = fVar178 * fStack_4d8;
        auVar103._12_4_ = fVar179 * fStack_4d4;
        auVar103._16_4_ = fVar178 * fStack_4d0;
        auVar103._20_4_ = fVar179 * fStack_4cc;
        auVar103._24_4_ = fVar178 * fStack_4c8;
        auVar103._28_4_ = 0;
        auVar19 = vfmadd213ps_fma(auVar140,local_280,auVar103);
        auVar19 = vfmadd213ps_fma(auVar107,local_460,ZEXT1632(auVar19));
        auVar146 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar140 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar109 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar110 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar111 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar112 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar113 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar114 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar173 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        auVar159._0_4_ = fVar109 * fVar201;
        auVar159._4_4_ = fVar110 * fVar201;
        auVar159._8_4_ = fVar111 * fVar201;
        auVar159._12_4_ = fVar112 * fVar201;
        auVar159._16_4_ = fVar113 * fVar201;
        auVar159._20_4_ = fVar114 * fVar201;
        auVar159._24_4_ = fVar173 * fVar201;
        auVar159._28_4_ = 0;
        auVar24._4_4_ = fVar209 * fVar110;
        auVar24._0_4_ = fVar207 * fVar109;
        auVar24._8_4_ = fVar207 * fVar111;
        auVar24._12_4_ = fVar209 * fVar112;
        auVar24._16_4_ = fVar207 * fVar113;
        auVar24._20_4_ = fVar209 * fVar114;
        auVar24._24_4_ = fVar207 * fVar173;
        auVar24._28_4_ = auVar17._4_4_;
        auVar193._0_4_ = fVar178 * fVar109;
        auVar193._4_4_ = fVar179 * fVar110;
        auVar193._8_4_ = fVar178 * fVar111;
        auVar193._12_4_ = fVar179 * fVar112;
        auVar193._16_4_ = fVar178 * fVar113;
        auVar193._20_4_ = fVar179 * fVar114;
        auVar193._24_4_ = fVar178 * fVar173;
        auVar193._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar159,auVar140,auVar137);
        auVar97 = vfmadd231ps_fma(auVar24,auVar140,auVar158);
        auVar96 = vfmadd231ps_fma(auVar193,local_280,auVar140);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,local_6e0);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar107,auVar143);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar107,local_460);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar146,auVar213);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar146,local_500);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_480,auVar146);
        fVar109 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar110 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar111 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar112 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar113 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar114 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar173 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        auVar107._4_4_ = fVar110 * fVar201;
        auVar107._0_4_ = fVar109 * fVar201;
        auVar107._8_4_ = fVar111 * fVar201;
        auVar107._12_4_ = fVar112 * fVar201;
        auVar107._16_4_ = fVar113 * fVar201;
        auVar107._20_4_ = fVar114 * fVar201;
        auVar107._24_4_ = fVar173 * fVar201;
        auVar107._28_4_ = auVar146._28_4_;
        auVar140._4_4_ = fVar209 * fVar110;
        auVar140._0_4_ = fVar207 * fVar109;
        auVar140._8_4_ = fVar207 * fVar111;
        auVar140._12_4_ = fVar209 * fVar112;
        auVar140._16_4_ = fVar207 * fVar113;
        auVar140._20_4_ = fVar209 * fVar114;
        auVar140._24_4_ = fVar207 * fVar173;
        auVar140._28_4_ = fVar179;
        auVar25._4_4_ = fVar179 * fVar110;
        auVar25._0_4_ = fVar178 * fVar109;
        auVar25._8_4_ = fVar178 * fVar111;
        auVar25._12_4_ = fVar179 * fVar112;
        auVar25._16_4_ = fVar178 * fVar113;
        auVar25._20_4_ = fVar179 * fVar114;
        auVar25._24_4_ = fVar178 * fVar173;
        auVar25._28_4_ = auVar16._4_4_;
        auVar146 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar107,auVar146,auVar137);
        auVar130 = vfmadd231ps_fma(auVar140,auVar146,auVar158);
        auVar117 = vfmadd231ps_fma(auVar25,auVar146,local_280);
        auVar146 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar146,local_6e0);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar146,auVar143);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar146,local_460);
        auVar146 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar146,auVar213);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar146,local_500);
        auVar122._8_4_ = 0x7fffffff;
        auVar122._0_8_ = 0x7fffffff7fffffff;
        auVar122._12_4_ = 0x7fffffff;
        auVar122._16_4_ = 0x7fffffff;
        auVar122._20_4_ = 0x7fffffff;
        auVar122._24_4_ = 0x7fffffff;
        auVar122._28_4_ = 0x7fffffff;
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_480,auVar146);
        auVar146 = vandps_avx(ZEXT1632(auVar17),auVar122);
        auVar107 = vandps_avx(ZEXT1632(auVar97),auVar122);
        auVar107 = vmaxps_avx(auVar146,auVar107);
        auVar146 = vandps_avx(ZEXT1632(auVar96),auVar122);
        auVar146 = vmaxps_avx(auVar107,auVar146);
        auVar138._4_4_ = fVar129;
        auVar138._0_4_ = fVar129;
        auVar138._8_4_ = fVar129;
        auVar138._12_4_ = fVar129;
        auVar138._16_4_ = fVar129;
        auVar138._20_4_ = fVar129;
        auVar138._24_4_ = fVar129;
        auVar138._28_4_ = fVar129;
        auVar146 = vcmpps_avx(auVar146,auVar138,1);
        auVar140 = vblendvps_avx(ZEXT1632(auVar17),auVar208,auVar146);
        auVar166 = vblendvps_avx(ZEXT1632(auVar97),auVar182,auVar146);
        auVar146 = vandps_avx(ZEXT1632(auVar16),auVar122);
        auVar107 = vandps_avx(ZEXT1632(auVar130),auVar122);
        auVar186 = vmaxps_avx(auVar146,auVar107);
        auVar146 = vandps_avx(ZEXT1632(auVar117),auVar122);
        auVar146 = vmaxps_avx(auVar186,auVar146);
        auVar160 = vcmpps_avx(auVar146,auVar138,1);
        auVar146 = vblendvps_avx(ZEXT1632(auVar16),auVar208,auVar160);
        auVar186 = vblendvps_avx(ZEXT1632(auVar130),auVar182,auVar160);
        auVar16 = vfmadd213ps_fma(auVar99,local_480,ZEXT1632(auVar19));
        auVar17 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar166,auVar166);
        auVar99 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar129 = auVar99._0_4_;
        fVar109 = auVar99._4_4_;
        fVar110 = auVar99._8_4_;
        fVar111 = auVar99._12_4_;
        fVar112 = auVar99._16_4_;
        fVar113 = auVar99._20_4_;
        fVar114 = auVar99._24_4_;
        auVar182._4_4_ = fVar109 * fVar109 * fVar109 * auVar17._4_4_ * -0.5;
        auVar182._0_4_ = fVar129 * fVar129 * fVar129 * auVar17._0_4_ * -0.5;
        auVar182._8_4_ = fVar110 * fVar110 * fVar110 * auVar17._8_4_ * -0.5;
        auVar182._12_4_ = fVar111 * fVar111 * fVar111 * auVar17._12_4_ * -0.5;
        auVar182._16_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar182._20_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar182._24_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar182._28_4_ = auVar107._28_4_;
        auVar214._8_4_ = 0x3fc00000;
        auVar214._0_8_ = 0x3fc000003fc00000;
        auVar214._12_4_ = 0x3fc00000;
        auVar214._16_4_ = 0x3fc00000;
        auVar214._20_4_ = 0x3fc00000;
        auVar214._24_4_ = 0x3fc00000;
        auVar214._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar182,auVar214,auVar99);
        fVar129 = auVar17._0_4_;
        fVar109 = auVar17._4_4_;
        auVar26._4_4_ = fVar109 * auVar166._4_4_;
        auVar26._0_4_ = fVar129 * auVar166._0_4_;
        fVar110 = auVar17._8_4_;
        auVar26._8_4_ = fVar110 * auVar166._8_4_;
        fVar111 = auVar17._12_4_;
        auVar26._12_4_ = fVar111 * auVar166._12_4_;
        auVar26._16_4_ = auVar166._16_4_ * 0.0;
        auVar26._20_4_ = auVar166._20_4_ * 0.0;
        auVar26._24_4_ = auVar166._24_4_ * 0.0;
        auVar26._28_4_ = 0;
        auVar27._4_4_ = fVar109 * -auVar140._4_4_;
        auVar27._0_4_ = fVar129 * -auVar140._0_4_;
        auVar27._8_4_ = fVar110 * -auVar140._8_4_;
        auVar27._12_4_ = fVar111 * -auVar140._12_4_;
        auVar27._16_4_ = -auVar140._16_4_ * 0.0;
        auVar27._20_4_ = -auVar140._20_4_ * 0.0;
        auVar27._24_4_ = -auVar140._24_4_ * 0.0;
        auVar27._28_4_ = auVar99._28_4_;
        auVar17 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar186,auVar186);
        auVar107 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar28._28_4_ = auVar160._28_4_;
        auVar28._0_28_ =
             ZEXT1628(CONCAT412(fVar111 * 0.0,
                                CONCAT48(fVar110 * 0.0,CONCAT44(fVar109 * 0.0,fVar129 * 0.0))));
        fVar129 = auVar107._0_4_;
        fVar109 = auVar107._4_4_;
        fVar110 = auVar107._8_4_;
        fVar111 = auVar107._12_4_;
        fVar112 = auVar107._16_4_;
        fVar113 = auVar107._20_4_;
        fVar114 = auVar107._24_4_;
        auVar29._4_4_ = fVar109 * fVar109 * fVar109 * auVar17._4_4_ * -0.5;
        auVar29._0_4_ = fVar129 * fVar129 * fVar129 * auVar17._0_4_ * -0.5;
        auVar29._8_4_ = fVar110 * fVar110 * fVar110 * auVar17._8_4_ * -0.5;
        auVar29._12_4_ = fVar111 * fVar111 * fVar111 * auVar17._12_4_ * -0.5;
        auVar29._16_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar29._20_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar29._24_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar29._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar29,auVar214,auVar107);
        fVar129 = auVar17._0_4_;
        auVar194._0_4_ = auVar186._0_4_ * fVar129;
        fVar109 = auVar17._4_4_;
        auVar194._4_4_ = auVar186._4_4_ * fVar109;
        fVar110 = auVar17._8_4_;
        auVar194._8_4_ = auVar186._8_4_ * fVar110;
        fVar111 = auVar17._12_4_;
        auVar194._12_4_ = auVar186._12_4_ * fVar111;
        auVar194._16_4_ = auVar186._16_4_ * 0.0;
        auVar194._20_4_ = auVar186._20_4_ * 0.0;
        auVar194._24_4_ = auVar186._24_4_ * 0.0;
        auVar194._28_4_ = 0;
        auVar30._4_4_ = -auVar146._4_4_ * fVar109;
        auVar30._0_4_ = -auVar146._0_4_ * fVar129;
        auVar30._8_4_ = -auVar146._8_4_ * fVar110;
        auVar30._12_4_ = -auVar146._12_4_ * fVar111;
        auVar30._16_4_ = -auVar146._16_4_ * 0.0;
        auVar30._20_4_ = -auVar146._20_4_ * 0.0;
        auVar30._24_4_ = -auVar146._24_4_ * 0.0;
        auVar30._28_4_ = auVar186._28_4_;
        auVar31._28_4_ = auVar107._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar111 * 0.0,
                                CONCAT48(fVar110 * 0.0,CONCAT44(fVar109 * 0.0,fVar129 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar116),local_4c0);
        auVar146 = ZEXT1632(auVar116);
        auVar19 = vfmadd213ps_fma(auVar27,auVar146,auVar100);
        auVar97 = vfmadd213ps_fma(auVar28,auVar146,ZEXT1632(auVar16));
        auVar117 = vfnmadd213ps_fma(auVar26,auVar146,local_4c0);
        auVar96 = vfmadd213ps_fma(auVar194,ZEXT1632(auVar95),auVar120);
        auVar142 = vfnmadd213ps_fma(auVar27,auVar146,auVar100);
        auVar146 = ZEXT1632(auVar95);
        auVar130 = vfmadd213ps_fma(auVar30,auVar146,local_2e0);
        auVar167 = ZEXT1632(auVar116);
        auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar167,auVar28);
        auVar16 = vfmadd213ps_fma(auVar31,auVar146,ZEXT1632(auVar14));
        auVar148 = vfnmadd213ps_fma(auVar194,auVar146,auVar120);
        auVar94 = vfnmadd213ps_fma(auVar30,auVar146,local_2e0);
        auVar147 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar95),auVar31);
        auVar146 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar142));
        auVar107 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar115));
        auVar100._4_4_ = auVar115._4_4_ * auVar146._4_4_;
        auVar100._0_4_ = auVar115._0_4_ * auVar146._0_4_;
        auVar100._8_4_ = auVar115._8_4_ * auVar146._8_4_;
        auVar100._12_4_ = auVar115._12_4_ * auVar146._12_4_;
        auVar100._16_4_ = auVar146._16_4_ * 0.0;
        auVar100._20_4_ = auVar146._20_4_ * 0.0;
        auVar100._24_4_ = auVar146._24_4_ * 0.0;
        auVar100._28_4_ = 0;
        auVar116 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar142),auVar107);
        auVar120._4_4_ = auVar107._4_4_ * auVar117._4_4_;
        auVar120._0_4_ = auVar107._0_4_ * auVar117._0_4_;
        auVar120._8_4_ = auVar107._8_4_ * auVar117._8_4_;
        auVar120._12_4_ = auVar107._12_4_ * auVar117._12_4_;
        auVar120._16_4_ = auVar107._16_4_ * 0.0;
        auVar120._20_4_ = auVar107._20_4_ * 0.0;
        auVar120._24_4_ = auVar107._24_4_ * 0.0;
        auVar120._28_4_ = auVar107._28_4_;
        auVar107 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar117));
        auVar14 = vfmsub231ps_fma(auVar120,ZEXT1632(auVar115),auVar107);
        auVar32._4_4_ = auVar142._4_4_ * auVar107._4_4_;
        auVar32._0_4_ = auVar142._0_4_ * auVar107._0_4_;
        auVar32._8_4_ = auVar142._8_4_ * auVar107._8_4_;
        auVar32._12_4_ = auVar142._12_4_ * auVar107._12_4_;
        auVar32._16_4_ = auVar107._16_4_ * 0.0;
        auVar32._20_4_ = auVar107._20_4_ * 0.0;
        auVar32._24_4_ = auVar107._24_4_ * 0.0;
        auVar32._28_4_ = auVar107._28_4_;
        auVar160 = ZEXT1632(auVar117);
        auVar117 = vfmsub231ps_fma(auVar32,auVar160,auVar146);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar116));
        auVar101 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
        auVar146 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar17),auVar101);
        auVar107 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar19),auVar101);
        auVar140 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar97),auVar101);
        auVar99 = vblendvps_avx(auVar160,ZEXT1632(auVar96),auVar101);
        auVar166 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar130),auVar101);
        auVar186 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar16),auVar101);
        auVar160 = vblendvps_avx(ZEXT1632(auVar96),auVar160,auVar101);
        auVar108 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar142),auVar101);
        auVar14 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
        auVar182 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar115),auVar101);
        auVar20 = vsubps_avx(auVar160,auVar146);
        auVar21 = vsubps_avx(auVar108,auVar107);
        auVar22 = vsubps_avx(auVar182,auVar140);
        auVar100 = vsubps_avx(auVar146,auVar99);
        auVar120 = vsubps_avx(auVar107,auVar166);
        auVar121 = vsubps_avx(auVar140,auVar186);
        auVar33._4_4_ = auVar22._4_4_ * auVar146._4_4_;
        auVar33._0_4_ = auVar22._0_4_ * auVar146._0_4_;
        auVar33._8_4_ = auVar22._8_4_ * auVar146._8_4_;
        auVar33._12_4_ = auVar22._12_4_ * auVar146._12_4_;
        auVar33._16_4_ = auVar22._16_4_ * auVar146._16_4_;
        auVar33._20_4_ = auVar22._20_4_ * auVar146._20_4_;
        auVar33._24_4_ = auVar22._24_4_ * auVar146._24_4_;
        auVar33._28_4_ = auVar182._28_4_;
        auVar16 = vfmsub231ps_fma(auVar33,auVar140,auVar20);
        auVar34._4_4_ = auVar20._4_4_ * auVar107._4_4_;
        auVar34._0_4_ = auVar20._0_4_ * auVar107._0_4_;
        auVar34._8_4_ = auVar20._8_4_ * auVar107._8_4_;
        auVar34._12_4_ = auVar20._12_4_ * auVar107._12_4_;
        auVar34._16_4_ = auVar20._16_4_ * auVar107._16_4_;
        auVar34._20_4_ = auVar20._20_4_ * auVar107._20_4_;
        auVar34._24_4_ = auVar20._24_4_ * auVar107._24_4_;
        auVar34._28_4_ = auVar160._28_4_;
        auVar17 = vfmsub231ps_fma(auVar34,auVar146,auVar21);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar104._0_4_ = auVar21._0_4_ * auVar140._0_4_;
        auVar104._4_4_ = auVar21._4_4_ * auVar140._4_4_;
        auVar104._8_4_ = auVar21._8_4_ * auVar140._8_4_;
        auVar104._12_4_ = auVar21._12_4_ * auVar140._12_4_;
        auVar104._16_4_ = auVar21._16_4_ * auVar140._16_4_;
        auVar104._20_4_ = auVar21._20_4_ * auVar140._20_4_;
        auVar104._24_4_ = auVar21._24_4_ * auVar140._24_4_;
        auVar104._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar104,auVar107,auVar22);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar105._0_4_ = auVar121._0_4_ * auVar99._0_4_;
        auVar105._4_4_ = auVar121._4_4_ * auVar99._4_4_;
        auVar105._8_4_ = auVar121._8_4_ * auVar99._8_4_;
        auVar105._12_4_ = auVar121._12_4_ * auVar99._12_4_;
        auVar105._16_4_ = auVar121._16_4_ * auVar99._16_4_;
        auVar105._20_4_ = auVar121._20_4_ * auVar99._20_4_;
        auVar105._24_4_ = auVar121._24_4_ * auVar99._24_4_;
        auVar105._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar105,auVar100,auVar186);
        auVar35._4_4_ = auVar120._4_4_ * auVar186._4_4_;
        auVar35._0_4_ = auVar120._0_4_ * auVar186._0_4_;
        auVar35._8_4_ = auVar120._8_4_ * auVar186._8_4_;
        auVar35._12_4_ = auVar120._12_4_ * auVar186._12_4_;
        auVar35._16_4_ = auVar120._16_4_ * auVar186._16_4_;
        auVar35._20_4_ = auVar120._20_4_ * auVar186._20_4_;
        auVar35._24_4_ = auVar120._24_4_ * auVar186._24_4_;
        auVar35._28_4_ = auVar186._28_4_;
        auVar19 = vfmsub231ps_fma(auVar35,auVar166,auVar121);
        auVar36._4_4_ = auVar100._4_4_ * auVar166._4_4_;
        auVar36._0_4_ = auVar100._0_4_ * auVar166._0_4_;
        auVar36._8_4_ = auVar100._8_4_ * auVar166._8_4_;
        auVar36._12_4_ = auVar100._12_4_ * auVar166._12_4_;
        auVar36._16_4_ = auVar100._16_4_ * auVar166._16_4_;
        auVar36._20_4_ = auVar100._20_4_ * auVar166._20_4_;
        auVar36._24_4_ = auVar100._24_4_ * auVar166._24_4_;
        auVar36._28_4_ = auVar108._28_4_;
        auVar97 = vfmsub231ps_fma(auVar36,auVar120,auVar99);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar99 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar19));
        auVar99 = vcmpps_avx(auVar99,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
        auVar14 = vpand_avx(auVar16,auVar14);
        auVar99 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0x7f,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar99 >> 0xbf,0) == '\0') &&
            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar99[0x1f]) {
LAB_0161c1d7:
          auVar177 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar200 = ZEXT3264(auVar199);
        }
        else {
          auVar37._4_4_ = auVar21._4_4_ * auVar121._4_4_;
          auVar37._0_4_ = auVar21._0_4_ * auVar121._0_4_;
          auVar37._8_4_ = auVar21._8_4_ * auVar121._8_4_;
          auVar37._12_4_ = auVar21._12_4_ * auVar121._12_4_;
          auVar37._16_4_ = auVar21._16_4_ * auVar121._16_4_;
          auVar37._20_4_ = auVar21._20_4_ * auVar121._20_4_;
          auVar37._24_4_ = auVar21._24_4_ * auVar121._24_4_;
          auVar37._28_4_ = auVar99._28_4_;
          auVar130 = vfmsub231ps_fma(auVar37,auVar120,auVar22);
          auVar123._0_4_ = auVar22._0_4_ * auVar100._0_4_;
          auVar123._4_4_ = auVar22._4_4_ * auVar100._4_4_;
          auVar123._8_4_ = auVar22._8_4_ * auVar100._8_4_;
          auVar123._12_4_ = auVar22._12_4_ * auVar100._12_4_;
          auVar123._16_4_ = auVar22._16_4_ * auVar100._16_4_;
          auVar123._20_4_ = auVar22._20_4_ * auVar100._20_4_;
          auVar123._24_4_ = auVar22._24_4_ * auVar100._24_4_;
          auVar123._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar123,auVar20,auVar121);
          auVar38._4_4_ = auVar20._4_4_ * auVar120._4_4_;
          auVar38._0_4_ = auVar20._0_4_ * auVar120._0_4_;
          auVar38._8_4_ = auVar20._8_4_ * auVar120._8_4_;
          auVar38._12_4_ = auVar20._12_4_ * auVar120._12_4_;
          auVar38._16_4_ = auVar20._16_4_ * auVar120._16_4_;
          auVar38._20_4_ = auVar20._20_4_ * auVar120._20_4_;
          auVar38._24_4_ = auVar20._24_4_ * auVar120._24_4_;
          auVar38._28_4_ = auVar166._28_4_;
          auVar116 = vfmsub231ps_fma(auVar38,auVar100,auVar21);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar116));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar130),_DAT_01faff00);
          auVar99 = vrcpps_avx(ZEXT1632(auVar97));
          auVar195._8_4_ = 0x3f800000;
          auVar195._0_8_ = 0x3f8000003f800000;
          auVar195._12_4_ = 0x3f800000;
          auVar195._16_4_ = 0x3f800000;
          auVar195._20_4_ = 0x3f800000;
          auVar195._24_4_ = 0x3f800000;
          auVar195._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar99,ZEXT1632(auVar97),auVar195);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar99,auVar99);
          auVar168._0_4_ = auVar116._0_4_ * auVar140._0_4_;
          auVar168._4_4_ = auVar116._4_4_ * auVar140._4_4_;
          auVar168._8_4_ = auVar116._8_4_ * auVar140._8_4_;
          auVar168._12_4_ = auVar116._12_4_ * auVar140._12_4_;
          auVar168._16_4_ = auVar140._16_4_ * 0.0;
          auVar168._20_4_ = auVar140._20_4_ * 0.0;
          auVar168._24_4_ = auVar140._24_4_ * 0.0;
          auVar168._28_4_ = 0;
          auVar96 = vfmadd231ps_fma(auVar168,auVar107,ZEXT1632(auVar96));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar130),auVar146);
          fVar129 = auVar16._0_4_;
          fVar109 = auVar16._4_4_;
          fVar110 = auVar16._8_4_;
          fVar111 = auVar16._12_4_;
          auVar99 = ZEXT1632(CONCAT412(fVar111 * auVar96._12_4_,
                                       CONCAT48(fVar110 * auVar96._8_4_,
                                                CONCAT44(fVar109 * auVar96._4_4_,
                                                         fVar129 * auVar96._0_4_))));
          auVar106._4_4_ = uVar85;
          auVar106._0_4_ = uVar85;
          auVar106._8_4_ = uVar85;
          auVar106._12_4_ = uVar85;
          auVar106._16_4_ = uVar85;
          auVar106._20_4_ = uVar85;
          auVar106._24_4_ = uVar85;
          auVar106._28_4_ = uVar85;
          uVar196 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar124._4_4_ = uVar196;
          auVar124._0_4_ = uVar196;
          auVar124._8_4_ = uVar196;
          auVar124._12_4_ = uVar196;
          auVar124._16_4_ = uVar196;
          auVar124._20_4_ = uVar196;
          auVar124._24_4_ = uVar196;
          auVar124._28_4_ = uVar196;
          auVar146 = vcmpps_avx(auVar106,auVar99,2);
          auVar107 = vcmpps_avx(auVar99,auVar124,2);
          auVar146 = vandps_avx(auVar107,auVar146);
          auVar16 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
          auVar14 = vpand_avx(auVar14,auVar16);
          auVar146 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0x7f,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0xbf,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar146[0x1f]) goto LAB_0161c1d7;
          auVar146 = vcmpps_avx(ZEXT1632(auVar97),ZEXT832(0) << 0x20,4);
          auVar16 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
          auVar14 = vpand_avx(auVar14,auVar16);
          auVar146 = vpmovsxwd_avx2(auVar14);
          auVar177 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar200 = ZEXT3264(auVar199);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar107 = ZEXT1632(CONCAT412(fVar111 * auVar17._12_4_,
                                          CONCAT48(fVar110 * auVar17._8_4_,
                                                   CONCAT44(fVar109 * auVar17._4_4_,
                                                            fVar129 * auVar17._0_4_))));
            auVar39._28_4_ = local_440._28_4_;
            auVar39._0_28_ =
                 ZEXT1628(CONCAT412(fVar111 * auVar19._12_4_,
                                    CONCAT48(fVar110 * auVar19._8_4_,
                                             CONCAT44(fVar109 * auVar19._4_4_,
                                                      fVar129 * auVar19._0_4_))));
            auVar154._8_4_ = 0x3f800000;
            auVar154._0_8_ = 0x3f8000003f800000;
            auVar154._12_4_ = 0x3f800000;
            auVar154._16_4_ = 0x3f800000;
            auVar154._20_4_ = 0x3f800000;
            auVar154._24_4_ = 0x3f800000;
            auVar154._28_4_ = 0x3f800000;
            auVar199 = vsubps_avx(auVar154,auVar107);
            auVar199 = vblendvps_avx(auVar199,auVar107,auVar101);
            auVar200 = ZEXT3264(auVar199);
            auVar199 = vsubps_avx(auVar154,auVar39);
            local_320 = vblendvps_avx(auVar199,auVar39,auVar101);
            auVar177 = ZEXT3264(auVar146);
            local_440 = auVar99;
          }
        }
        auVar206 = ZEXT3264(_local_5a0);
        auVar146 = auVar177._0_32_;
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0x7f,0) == '\0') &&
              (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar146 >> 0xbf,0) == '\0') &&
            (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar177[0x1f]) goto LAB_0161acc6;
        auVar199 = vsubps_avx(ZEXT1632(auVar95),auVar167);
        local_700 = auVar200._0_32_;
        auVar14 = vfmadd213ps_fma(auVar199,local_700,auVar167);
        fVar129 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar199._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar129;
        auVar199._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar129;
        auVar199._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar129;
        auVar199._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar129;
        auVar199._16_4_ = fVar129 * 0.0;
        auVar199._20_4_ = fVar129 * 0.0;
        auVar199._24_4_ = fVar129 * 0.0;
        auVar199._28_4_ = 0;
        auVar199 = vcmpps_avx(local_440,auVar199,6);
        auVar107 = auVar146 & auVar199;
        auVar177 = ZEXT3264(local_6e0);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
LAB_0161ad8c:
          bVar84 = false;
        }
        else {
          auVar125._8_4_ = 0xbf800000;
          auVar125._0_8_ = 0xbf800000bf800000;
          auVar125._12_4_ = 0xbf800000;
          auVar125._16_4_ = 0xbf800000;
          auVar125._20_4_ = 0xbf800000;
          auVar125._24_4_ = 0xbf800000;
          auVar125._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar14 = vfmadd213ps_fma(local_320,auVar139,auVar125);
          local_240 = ZEXT1632(auVar14);
          local_200 = 0;
          local_320 = local_240;
          if ((pGVar89->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0161ad8c;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar84 = true, pGVar89->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar146 = vandps_avx(auVar199,auVar146);
            fVar129 = 1.0 / auVar102._0_4_;
            local_180[0] = fVar129 * (auVar200._0_4_ + 0.0);
            local_180[1] = fVar129 * (auVar200._4_4_ + 1.0);
            local_180[2] = fVar129 * (auVar200._8_4_ + 2.0);
            local_180[3] = fVar129 * (auVar200._12_4_ + 3.0);
            fStack_170 = fVar129 * (auVar200._16_4_ + 4.0);
            fStack_16c = fVar129 * (auVar200._20_4_ + 5.0);
            fStack_168 = fVar129 * (auVar200._24_4_ + 6.0);
            fStack_164 = auVar200._28_4_ + 7.0;
            local_320._0_8_ = auVar14._0_8_;
            local_320._8_8_ = auVar14._8_8_;
            local_160 = local_320._0_8_;
            uStack_158 = local_320._8_8_;
            uStack_150 = 0;
            uStack_148 = 0;
            local_140 = local_440;
            uVar85 = vmovmskps_avx(auVar146);
            if (uVar85 == 0) goto LAB_0161ad8c;
            uVar86 = 0;
            uVar88 = (ulong)(uVar85 & 0xff);
            for (uVar87 = uVar88; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
              uVar86 = uVar86 + 1;
            }
            local_820._0_4_ = local_820._4_4_;
            local_820._8_4_ = local_820._4_4_;
            local_820._12_4_ = local_820._4_4_;
            local_600._0_4_ = local_600._4_4_;
            local_600._8_4_ = local_600._4_4_;
            local_600._16_16_ = auVar140._16_16_;
            local_600._12_4_ = local_600._4_4_;
            local_580 = ZEXT1632(*local_638);
            local_4a0 = ZEXT1632(CONCAT124(auVar18._4_12_,*(undefined4 *)(ray + k * 4 + 0x80)));
            _local_4e0 = auVar208;
            _local_400 = *pauVar5;
            local_260 = local_700;
            local_220 = local_440;
            local_1fc = iVar12;
            local_1f0 = local_690;
            uStack_1e8 = uStack_688;
            local_1e0 = local_6a0;
            uStack_1d8 = uStack_698;
            local_1d0 = local_6b0;
            uStack_1c8 = uStack_6a8;
            do {
              fVar129 = local_180[uVar86];
              local_3a0._4_4_ = fVar129;
              local_3a0._0_4_ = fVar129;
              local_3a0._8_4_ = fVar129;
              local_3a0._12_4_ = fVar129;
              local_390 = *(undefined4 *)((long)&local_160 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar86 * 4);
              fVar109 = 1.0 - fVar129;
              auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3a0,ZEXT416(0xc0a00000)
                                       );
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * 3.0)),
                                        ZEXT416((uint)(fVar129 + fVar129)),auVar14);
              auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3a0,ZEXT416(0x40000000)
                                       );
              auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar109 * fVar109 * -3.0)),
                                        ZEXT416((uint)(fVar109 + fVar109)),auVar14);
              auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar129 * (fVar109 + fVar109))),
                                         ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),local_3a0,
                                        ZEXT416((uint)(fVar109 * -2.0)));
              fVar129 = auVar14._0_4_ * 0.5;
              fVar109 = auVar17._0_4_ * 0.5;
              auVar150._0_4_ = fVar109 * local_5b0;
              auVar150._4_4_ = fVar109 * fStack_5ac;
              auVar150._8_4_ = fVar109 * fStack_5a8;
              auVar150._12_4_ = fVar109 * fStack_5a4;
              auVar131._4_4_ = fVar129;
              auVar131._0_4_ = fVar129;
              auVar131._8_4_ = fVar129;
              auVar131._12_4_ = fVar129;
              auVar71._8_8_ = uStack_6a8;
              auVar71._0_8_ = local_6b0;
              auVar14 = vfmadd132ps_fma(auVar131,auVar150,auVar71);
              fVar129 = auVar16._0_4_ * 0.5;
              auVar151._4_4_ = fVar129;
              auVar151._0_4_ = fVar129;
              auVar151._8_4_ = fVar129;
              auVar151._12_4_ = fVar129;
              auVar73._8_8_ = uStack_698;
              auVar73._0_8_ = local_6a0;
              auVar14 = vfmadd132ps_fma(auVar151,auVar14,auVar73);
              local_630.context = context->user;
              fVar129 = auVar18._0_4_ * 0.5;
              auVar132._4_4_ = fVar129;
              auVar132._0_4_ = fVar129;
              auVar132._8_4_ = fVar129;
              auVar132._12_4_ = fVar129;
              auVar75._8_8_ = uStack_688;
              auVar75._0_8_ = local_690;
              auVar14 = vfmadd132ps_fma(auVar132,auVar14,auVar75);
              local_3d0 = auVar14._0_4_;
              local_3c0 = vshufps_avx(auVar14,auVar14,0x55);
              local_3b0 = vshufps_avx(auVar14,auVar14,0xaa);
              local_380 = local_600._0_8_;
              uStack_378 = local_600._8_8_;
              local_370 = local_820;
              vpcmpeqd_avx2(ZEXT1632(local_820),ZEXT1632(local_820));
              uStack_35c = (local_630.context)->instID[0];
              local_360 = uStack_35c;
              uStack_358 = uStack_35c;
              uStack_354 = uStack_35c;
              uStack_350 = (local_630.context)->instPrimID[0];
              uStack_34c = uStack_350;
              uStack_348 = uStack_350;
              uStack_344 = uStack_350;
              local_720 = local_580._0_16_;
              local_630.valid = (int *)local_720;
              local_630.geometryUserPtr = pGVar89->userPtr;
              local_630.hit = (RTCHitN *)&local_3d0;
              local_630.N = 4;
              local_630.ray = (RTCRayN *)ray;
              uStack_3cc = local_3d0;
              uStack_3c8 = local_3d0;
              uStack_3c4 = local_3d0;
              uStack_38c = local_390;
              uStack_388 = local_390;
              uStack_384 = local_390;
              if (pGVar89->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar89->occlusionFilterN)(&local_630);
                auVar206 = ZEXT3264(_local_5a0);
                auVar177 = ZEXT3264(local_6e0);
                auVar200 = ZEXT3264(local_700);
              }
              if (local_720 == (undefined1  [16])0x0) {
                auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar14 = auVar14 ^ _DAT_01f7ae20;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar89->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var13)(&local_630);
                  auVar206 = ZEXT3264(_local_5a0);
                  auVar177 = ZEXT3264(local_6e0);
                  auVar200 = ZEXT3264(local_700);
                }
                auVar16 = vpcmpeqd_avx(local_720,_DAT_01f7aa10);
                auVar14 = auVar16 ^ _DAT_01f7ae20;
                auVar133._8_4_ = 0xff800000;
                auVar133._0_8_ = 0xff800000ff800000;
                auVar133._12_4_ = 0xff800000;
                auVar16 = vblendvps_avx(auVar133,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                        auVar16);
                *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar16;
              }
              auVar118._8_8_ = 0x100000001;
              auVar118._0_8_ = 0x100000001;
              if ((auVar118 & auVar14) != (undefined1  [16])0x0) {
                bVar84 = true;
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0._0_4_;
              uVar87 = uVar86 & 0x3f;
              bVar84 = false;
              uVar86 = 0;
              uVar88 = uVar88 ^ 1L << uVar87;
              for (uVar87 = uVar88; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                uVar86 = uVar86 + 1;
              }
            } while (uVar88 != 0);
          }
        }
      }
      auVar187 = ZEXT3264(auVar187._0_32_);
      auVar128 = ZEXT3264(local_5e0);
      if (8 < iVar12) {
        local_4e0._4_4_ = iVar12;
        local_4e0._0_4_ = iVar12;
        fStack_4d8 = (float)iVar12;
        fStack_4d4 = (float)iVar12;
        fStack_4d0 = (float)iVar12;
        fStack_4cc = (float)iVar12;
        fStack_4c8 = (float)iVar12;
        iStack_4c4 = iVar12;
        local_300._4_4_ = local_680._0_4_;
        local_300._0_4_ = local_680._0_4_;
        local_300._8_4_ = local_680._0_4_;
        local_300._12_4_ = local_680._0_4_;
        local_300._16_4_ = local_680._0_4_;
        local_300._20_4_ = local_680._0_4_;
        local_300._24_4_ = local_680._0_4_;
        local_300._28_4_ = local_680._0_4_;
        local_100 = local_520._0_4_;
        uStack_fc = local_520._0_4_;
        uStack_f8 = local_520._0_4_;
        uStack_f4 = local_520._0_4_;
        uStack_f0 = local_520._0_4_;
        uStack_ec = local_520._0_4_;
        uStack_e8 = local_520._0_4_;
        uStack_e4 = local_520._0_4_;
        local_120 = 1.0 / (float)local_420._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_2b0 = (undefined4)local_708;
        uStack_2ac = (undefined4)local_708;
        uStack_2a8 = (undefined4)local_708;
        uStack_2a4 = (undefined4)local_708;
        local_5c0 = CONCAT44((undefined4)local_5c0,(undefined4)local_5c0);
        uStack_5b8 = (undefined4)local_5c0;
        uStack_5b4 = (undefined4)local_5c0;
        lVar90 = 8;
        local_700 = auVar200._0_32_;
        _local_5a0 = auVar206._0_32_;
        fVar129 = (float)local_660;
        fVar109 = local_660._4_4_;
        fVar110 = (float)uStack_658;
        fVar111 = uStack_658._4_4_;
        fVar112 = (float)uStack_650;
        fVar113 = uStack_650._4_4_;
        fVar114 = (float)uStack_648;
        uVar196 = uStack_648._4_4_;
        do {
          auVar182 = auVar187._0_32_;
          local_5e0 = auVar128._0_32_;
          auVar146 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 * 4 + lVar23);
          local_680 = *(undefined1 (*) [32])(lVar23 + 0x21b37f0 + lVar90 * 4);
          auVar199 = *(undefined1 (*) [32])(lVar23 + 0x21b3c74 + lVar90 * 4);
          pfVar6 = (float *)(lVar23 + 0x21b40f8 + lVar90 * 4);
          fVar173 = *pfVar6;
          fVar178 = pfVar6[1];
          fVar179 = pfVar6[2];
          fVar180 = pfVar6[3];
          fVar188 = pfVar6[4];
          fVar189 = pfVar6[5];
          fVar190 = pfVar6[6];
          auVar205._0_4_ = fVar201 * fVar173;
          auVar205._4_4_ = fVar201 * fVar178;
          auVar205._8_4_ = fVar201 * fVar179;
          auVar205._12_4_ = fVar201 * fVar180;
          auVar205._16_4_ = fVar201 * fVar188;
          auVar205._20_4_ = fVar201 * fVar189;
          auVar205._28_36_ = auVar206._28_36_;
          auVar205._24_4_ = fVar201 * fVar190;
          auVar187._0_4_ = fVar129 * fVar173;
          auVar187._4_4_ = fVar109 * fVar178;
          auVar187._8_4_ = fVar110 * fVar179;
          auVar187._12_4_ = fVar111 * fVar180;
          auVar187._16_4_ = fVar112 * fVar188;
          auVar187._20_4_ = fVar113 * fVar189;
          auVar187._28_36_ = auVar128._28_36_;
          auVar187._24_4_ = fVar114 * fVar190;
          auVar14 = vfmadd231ps_fma(auVar205._0_32_,auVar199,auVar137);
          auVar16 = vfmadd231ps_fma(auVar187._0_32_,auVar199,auVar158);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_680,auVar177._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_680,auVar143);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,auVar213);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar146,local_500);
          auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 * 4 + lVar23);
          auVar107 = *(undefined1 (*) [32])(lVar23 + 0x21b5c10 + lVar90 * 4);
          auVar140 = *(undefined1 (*) [32])(lVar23 + 0x21b6094 + lVar90 * 4);
          pfVar7 = (float *)(lVar23 + 0x21b6518 + lVar90 * 4);
          fVar70 = *pfVar7;
          fVar207 = pfVar7[1];
          fVar209 = pfVar7[2];
          fVar210 = pfVar7[3];
          fVar216 = pfVar7[4];
          fVar217 = pfVar7[5];
          fVar218 = pfVar7[6];
          auVar83._4_4_ = fVar201 * fVar207;
          auVar83._0_4_ = fVar201 * fVar70;
          auVar83._8_4_ = fVar201 * fVar209;
          auVar83._12_4_ = fVar201 * fVar210;
          auVar83._16_4_ = fVar201 * fVar216;
          auVar83._20_4_ = fVar201 * fVar217;
          auVar83._24_4_ = fVar201 * fVar218;
          auVar83._28_4_ = uVar92;
          auVar208._4_4_ = fVar109 * fVar207;
          auVar208._0_4_ = fVar129 * fVar70;
          auVar208._8_4_ = fVar110 * fVar209;
          auVar208._12_4_ = fVar111 * fVar210;
          auVar208._16_4_ = fVar112 * fVar216;
          auVar208._20_4_ = fVar113 * fVar217;
          auVar208._24_4_ = fVar114 * fVar218;
          auVar208._28_4_ = uVar196;
          auVar17 = vfmadd231ps_fma(auVar83,auVar140,auVar137);
          auVar18 = vfmadd231ps_fma(auVar208,auVar140,auVar158);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,auVar177._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar107,auVar143);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,auVar213);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar160,local_500);
          local_2e0 = ZEXT1632(auVar17);
          local_580 = ZEXT1632(auVar14);
          local_4c0 = vsubps_avx(local_2e0,local_580);
          auVar108 = ZEXT1632(auVar18);
          local_520 = ZEXT1632(auVar16);
          local_4a0 = vsubps_avx(auVar108,local_520);
          auVar40._4_4_ = local_4c0._4_4_ * auVar16._4_4_;
          auVar40._0_4_ = local_4c0._0_4_ * auVar16._0_4_;
          auVar40._8_4_ = local_4c0._8_4_ * auVar16._8_4_;
          auVar40._12_4_ = local_4c0._12_4_ * auVar16._12_4_;
          auVar40._16_4_ = local_4c0._16_4_ * 0.0;
          auVar40._20_4_ = local_4c0._20_4_ * 0.0;
          auVar40._24_4_ = local_4c0._24_4_ * 0.0;
          auVar40._28_4_ = pfVar6[7];
          fVar129 = local_4a0._0_4_;
          auVar126._0_4_ = auVar14._0_4_ * fVar129;
          fVar109 = local_4a0._4_4_;
          auVar126._4_4_ = auVar14._4_4_ * fVar109;
          fVar110 = local_4a0._8_4_;
          auVar126._8_4_ = auVar14._8_4_ * fVar110;
          fVar111 = local_4a0._12_4_;
          auVar126._12_4_ = auVar14._12_4_ * fVar111;
          fVar112 = local_4a0._16_4_;
          auVar126._16_4_ = fVar112 * 0.0;
          fVar113 = local_4a0._20_4_;
          auVar126._20_4_ = fVar113 * 0.0;
          fVar114 = local_4a0._24_4_;
          auVar126._24_4_ = fVar114 * 0.0;
          auVar126._28_4_ = 0;
          auVar206 = ZEXT3264(auVar199);
          auVar166 = vsubps_avx(auVar40,auVar126);
          auVar41._4_4_ = local_e0._4_4_ * fVar178;
          auVar41._0_4_ = (float)local_e0 * fVar173;
          auVar41._8_4_ = (float)uStack_d8 * fVar179;
          auVar41._12_4_ = uStack_d8._4_4_ * fVar180;
          auVar41._16_4_ = (float)uStack_d0 * fVar188;
          auVar41._20_4_ = uStack_d0._4_4_ * fVar189;
          auVar41._24_4_ = (float)uStack_c8 * fVar190;
          auVar41._28_4_ = 0;
          auVar14 = vfmadd231ps_fma(auVar41,auVar199,local_c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_680,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,auVar146);
          auVar42._4_4_ = local_e0._4_4_ * fVar207;
          auVar42._0_4_ = (float)local_e0 * fVar70;
          auVar42._8_4_ = (float)uStack_d8 * fVar209;
          auVar42._12_4_ = uStack_d8._4_4_ * fVar210;
          auVar42._16_4_ = (float)uStack_d0 * fVar216;
          auVar42._20_4_ = uStack_d0._4_4_ * fVar217;
          auVar42._24_4_ = (float)uStack_c8 * fVar218;
          auVar42._28_4_ = uStack_c8._4_4_;
          auVar16 = vfmadd231ps_fma(auVar42,auVar140,local_c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar107,local_a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar160,local_80);
          auVar43._4_4_ = fVar109 * fVar109;
          auVar43._0_4_ = fVar129 * fVar129;
          auVar43._8_4_ = fVar110 * fVar110;
          auVar43._12_4_ = fVar111 * fVar111;
          auVar43._16_4_ = fVar112 * fVar112;
          auVar43._20_4_ = fVar113 * fVar113;
          auVar43._24_4_ = fVar114 * fVar114;
          auVar43._28_4_ = local_80._28_4_;
          auVar17 = vfmadd231ps_fma(auVar43,local_4c0,local_4c0);
          _local_400 = ZEXT1632(auVar14);
          auVar208 = ZEXT1632(auVar16);
          auVar99 = vmaxps_avx(_local_400,auVar208);
          auVar183._0_4_ = auVar99._0_4_ * auVar99._0_4_ * auVar17._0_4_;
          auVar183._4_4_ = auVar99._4_4_ * auVar99._4_4_ * auVar17._4_4_;
          auVar183._8_4_ = auVar99._8_4_ * auVar99._8_4_ * auVar17._8_4_;
          auVar183._12_4_ = auVar99._12_4_ * auVar99._12_4_ * auVar17._12_4_;
          auVar183._16_4_ = auVar99._16_4_ * auVar99._16_4_ * 0.0;
          auVar183._20_4_ = auVar99._20_4_ * auVar99._20_4_ * 0.0;
          auVar183._24_4_ = auVar99._24_4_ * auVar99._24_4_ * 0.0;
          auVar183._28_4_ = 0;
          auVar44._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar44._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar44._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar44._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar44._16_4_ = auVar166._16_4_ * auVar166._16_4_;
          auVar44._20_4_ = auVar166._20_4_ * auVar166._20_4_;
          auVar44._24_4_ = auVar166._24_4_ * auVar166._24_4_;
          auVar44._28_4_ = auVar166._28_4_;
          auVar99 = vcmpps_avx(auVar44,auVar183,2);
          local_200 = (int)lVar90;
          auVar184._4_4_ = local_200;
          auVar184._0_4_ = local_200;
          auVar184._8_4_ = local_200;
          auVar184._12_4_ = local_200;
          auVar184._16_4_ = local_200;
          auVar184._20_4_ = local_200;
          auVar184._24_4_ = local_200;
          auVar184._28_4_ = local_200;
          auVar166 = vpor_avx2(auVar184,_DAT_01fe9900);
          auVar186 = vpcmpgtd_avx2(_local_4e0,auVar166);
          auVar166 = auVar186 & auVar99;
          fVar129 = (float)local_660;
          fVar109 = local_660._4_4_;
          fVar110 = (float)uStack_658;
          fVar111 = uStack_658._4_4_;
          fVar112 = (float)uStack_650;
          fVar113 = uStack_650._4_4_;
          fVar114 = (float)uStack_648;
          uVar196 = uStack_648._4_4_;
          if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0x7f,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0xbf,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar166[0x1f]) {
            auVar187 = ZEXT3264(auVar182);
LAB_0161bb6d:
            auVar128 = ZEXT3264(local_5e0);
            auVar177 = ZEXT3264(local_6e0);
          }
          else {
            local_420 = vandps_avx(auVar186,auVar99);
            auVar45._4_4_ = fVar207 * (float)local_5a0._4_4_;
            auVar45._0_4_ = fVar70 * (float)local_5a0._0_4_;
            auVar45._8_4_ = fVar209 * fStack_598;
            auVar45._12_4_ = fVar210 * fStack_594;
            auVar45._16_4_ = fVar216 * fStack_590;
            auVar45._20_4_ = fVar217 * fStack_58c;
            auVar45._24_4_ = fVar218 * fStack_588;
            auVar45._28_4_ = auVar99._28_4_;
            auVar14 = vfmadd213ps_fma(auVar140,local_280,auVar45);
            auVar14 = vfmadd213ps_fma(auVar107,local_460,ZEXT1632(auVar14));
            auVar14 = vfmadd213ps_fma(auVar160,local_480,ZEXT1632(auVar14));
            auVar46._4_4_ = fVar178 * (float)local_5a0._4_4_;
            auVar46._0_4_ = fVar173 * (float)local_5a0._0_4_;
            auVar46._8_4_ = fVar179 * fStack_598;
            auVar46._12_4_ = fVar180 * fStack_594;
            auVar46._16_4_ = fVar188 * fStack_590;
            auVar46._20_4_ = fVar189 * fStack_58c;
            auVar46._24_4_ = fVar190 * fStack_588;
            auVar46._28_4_ = auVar99._28_4_;
            auVar16 = vfmadd213ps_fma(auVar199,local_280,auVar46);
            auVar17 = vfmadd213ps_fma(local_680,local_460,ZEXT1632(auVar16));
            local_680 = ZEXT1632(auVar17);
            auVar199 = *(undefined1 (*) [32])(lVar23 + 0x21b457c + lVar90 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar23 + 0x21b4a00 + lVar90 * 4);
            auVar140 = *(undefined1 (*) [32])(lVar23 + 0x21b4e84 + lVar90 * 4);
            pfVar6 = (float *)(lVar23 + 0x21b5308 + lVar90 * 4);
            fVar173 = *pfVar6;
            fVar178 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar188 = pfVar6[4];
            fVar189 = pfVar6[5];
            fVar190 = pfVar6[6];
            auVar47._4_4_ = fVar201 * fVar178;
            auVar47._0_4_ = fVar201 * fVar173;
            auVar47._8_4_ = fVar201 * fVar179;
            auVar47._12_4_ = fVar201 * fVar180;
            auVar47._16_4_ = fVar201 * fVar188;
            auVar47._20_4_ = fVar201 * fVar189;
            auVar47._24_4_ = fVar201 * fVar190;
            auVar47._28_4_ = local_4c0._28_4_;
            auVar203._0_4_ = fVar173 * (float)local_660;
            auVar203._4_4_ = fVar178 * local_660._4_4_;
            auVar203._8_4_ = fVar179 * (float)uStack_658;
            auVar203._12_4_ = fVar180 * uStack_658._4_4_;
            auVar203._16_4_ = fVar188 * (float)uStack_650;
            auVar203._20_4_ = fVar189 * uStack_650._4_4_;
            auVar203._24_4_ = fVar190 * (float)uStack_648;
            auVar203._28_4_ = 0;
            auVar48._4_4_ = fVar178 * (float)local_5a0._4_4_;
            auVar48._0_4_ = fVar173 * (float)local_5a0._0_4_;
            auVar48._8_4_ = fVar179 * fStack_598;
            auVar48._12_4_ = fVar180 * fStack_594;
            auVar48._16_4_ = fVar188 * fStack_590;
            auVar48._20_4_ = fVar189 * fStack_58c;
            auVar48._24_4_ = fVar190 * fStack_588;
            auVar48._28_4_ = pfVar6[7];
            auVar16 = vfmadd231ps_fma(auVar47,auVar140,auVar137);
            auVar19 = vfmadd231ps_fma(auVar203,auVar140,auVar158);
            auVar97 = vfmadd231ps_fma(auVar48,local_280,auVar140);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar107,local_6e0);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar107,auVar143);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_460,auVar107);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar199,auVar213);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar199,local_500);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_480,auVar199);
            pfVar6 = (float *)(lVar23 + 0x21b7728 + lVar90 * 4);
            fVar173 = *pfVar6;
            fVar178 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar188 = pfVar6[4];
            fVar189 = pfVar6[5];
            fVar190 = pfVar6[6];
            auVar49._4_4_ = fVar201 * fVar178;
            auVar49._0_4_ = fVar201 * fVar173;
            auVar49._8_4_ = fVar201 * fVar179;
            auVar49._12_4_ = fVar201 * fVar180;
            auVar49._16_4_ = fVar201 * fVar188;
            auVar49._20_4_ = fVar201 * fVar189;
            auVar49._24_4_ = fVar201 * fVar190;
            auVar49._28_4_ = fVar201;
            auVar50._4_4_ = local_660._4_4_ * fVar178;
            auVar50._0_4_ = (float)local_660 * fVar173;
            auVar50._8_4_ = (float)uStack_658 * fVar179;
            auVar50._12_4_ = uStack_658._4_4_ * fVar180;
            auVar50._16_4_ = (float)uStack_650 * fVar188;
            auVar50._20_4_ = uStack_650._4_4_ * fVar189;
            auVar50._24_4_ = (float)uStack_648 * fVar190;
            auVar50._28_4_ = local_480._28_4_;
            auVar51._4_4_ = (float)local_5a0._4_4_ * fVar178;
            auVar51._0_4_ = (float)local_5a0._0_4_ * fVar173;
            auVar51._8_4_ = fStack_598 * fVar179;
            auVar51._12_4_ = fStack_594 * fVar180;
            auVar51._16_4_ = fStack_590 * fVar188;
            auVar51._20_4_ = fStack_58c * fVar189;
            auVar51._24_4_ = fStack_588 * fVar190;
            auVar51._28_4_ = pfVar6[7];
            auVar199 = *(undefined1 (*) [32])(lVar23 + 0x21b72a4 + lVar90 * 4);
            auVar96 = vfmadd231ps_fma(auVar49,auVar199,auVar137);
            auVar130 = vfmadd231ps_fma(auVar50,auVar199,auVar158);
            auVar116 = vfmadd231ps_fma(auVar51,local_280,auVar199);
            auVar199 = *(undefined1 (*) [32])(lVar23 + 0x21b6e20 + lVar90 * 4);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar199,local_6e0);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar199,auVar143);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_460,auVar199);
            auVar199 = *(undefined1 (*) [32])(lVar23 + 0x21b699c + lVar90 * 4);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar199,auVar213);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar199,local_500);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_480,auVar199);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar185._16_4_ = 0x7fffffff;
            auVar185._20_4_ = 0x7fffffff;
            auVar185._24_4_ = 0x7fffffff;
            auVar185._28_4_ = 0x7fffffff;
            auVar199 = vandps_avx(ZEXT1632(auVar16),auVar185);
            auVar107 = vandps_avx(ZEXT1632(auVar19),auVar185);
            auVar107 = vmaxps_avx(auVar199,auVar107);
            auVar199 = vandps_avx(ZEXT1632(auVar97),auVar185);
            auVar199 = vmaxps_avx(auVar107,auVar199);
            auVar199 = vcmpps_avx(auVar199,local_300,1);
            auVar140 = vblendvps_avx(ZEXT1632(auVar16),local_4c0,auVar199);
            auVar99 = vblendvps_avx(ZEXT1632(auVar19),local_4a0,auVar199);
            auVar199 = vandps_avx(ZEXT1632(auVar96),auVar185);
            auVar107 = vandps_avx(ZEXT1632(auVar130),auVar185);
            auVar107 = vmaxps_avx(auVar199,auVar107);
            auVar199 = vandps_avx(auVar185,ZEXT1632(auVar116));
            auVar199 = vmaxps_avx(auVar107,auVar199);
            auVar107 = vcmpps_avx(auVar199,local_300,1);
            auVar199 = vblendvps_avx(ZEXT1632(auVar96),local_4c0,auVar107);
            auVar107 = vblendvps_avx(ZEXT1632(auVar130),local_4a0,auVar107);
            auVar16 = vfmadd213ps_fma(auVar146,local_480,local_680);
            auVar19 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar99,auVar99);
            auVar146 = vrsqrtps_avx(ZEXT1632(auVar19));
            fVar173 = auVar146._0_4_;
            fVar178 = auVar146._4_4_;
            fVar179 = auVar146._8_4_;
            fVar180 = auVar146._12_4_;
            fVar188 = auVar146._16_4_;
            fVar189 = auVar146._20_4_;
            fVar190 = auVar146._24_4_;
            auVar52._4_4_ = fVar178 * fVar178 * fVar178 * auVar19._4_4_ * -0.5;
            auVar52._0_4_ = fVar173 * fVar173 * fVar173 * auVar19._0_4_ * -0.5;
            auVar52._8_4_ = fVar179 * fVar179 * fVar179 * auVar19._8_4_ * -0.5;
            auVar52._12_4_ = fVar180 * fVar180 * fVar180 * auVar19._12_4_ * -0.5;
            auVar52._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar52._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
            auVar52._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar52._28_4_ = 0;
            auVar215._8_4_ = 0x3fc00000;
            auVar215._0_8_ = 0x3fc000003fc00000;
            auVar215._12_4_ = 0x3fc00000;
            auVar215._16_4_ = 0x3fc00000;
            auVar215._20_4_ = 0x3fc00000;
            auVar215._24_4_ = 0x3fc00000;
            auVar215._28_4_ = 0x3fc00000;
            auVar19 = vfmadd231ps_fma(auVar52,auVar215,auVar146);
            fVar173 = auVar19._0_4_;
            fVar178 = auVar19._4_4_;
            auVar53._4_4_ = auVar99._4_4_ * fVar178;
            auVar53._0_4_ = auVar99._0_4_ * fVar173;
            fVar179 = auVar19._8_4_;
            auVar53._8_4_ = auVar99._8_4_ * fVar179;
            fVar180 = auVar19._12_4_;
            auVar53._12_4_ = auVar99._12_4_ * fVar180;
            auVar53._16_4_ = auVar99._16_4_ * 0.0;
            auVar53._20_4_ = auVar99._20_4_ * 0.0;
            auVar53._24_4_ = auVar99._24_4_ * 0.0;
            auVar53._28_4_ = auVar146._28_4_;
            auVar54._4_4_ = fVar178 * -auVar140._4_4_;
            auVar54._0_4_ = fVar173 * -auVar140._0_4_;
            auVar54._8_4_ = fVar179 * -auVar140._8_4_;
            auVar54._12_4_ = fVar180 * -auVar140._12_4_;
            auVar54._16_4_ = -auVar140._16_4_ * 0.0;
            auVar54._20_4_ = -auVar140._20_4_ * 0.0;
            auVar54._24_4_ = -auVar140._24_4_ * 0.0;
            auVar54._28_4_ = auVar99._28_4_;
            auVar19 = vfmadd213ps_fma(auVar199,auVar199,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar107,auVar107);
            auVar146 = vrsqrtps_avx(ZEXT1632(auVar19));
            auVar55._28_4_ = auVar15._4_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar178 * 0.0,fVar173 * 0.0))));
            fVar173 = auVar146._0_4_;
            fVar178 = auVar146._4_4_;
            fVar179 = auVar146._8_4_;
            fVar180 = auVar146._12_4_;
            fVar188 = auVar146._16_4_;
            fVar189 = auVar146._20_4_;
            fVar190 = auVar146._24_4_;
            auVar56._4_4_ = fVar178 * fVar178 * fVar178 * auVar19._4_4_ * -0.5;
            auVar56._0_4_ = fVar173 * fVar173 * fVar173 * auVar19._0_4_ * -0.5;
            auVar56._8_4_ = fVar179 * fVar179 * fVar179 * auVar19._8_4_ * -0.5;
            auVar56._12_4_ = fVar180 * fVar180 * fVar180 * auVar19._12_4_ * -0.5;
            auVar56._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar56._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
            auVar56._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar56._28_4_ = 0;
            auVar19 = vfmadd231ps_fma(auVar56,auVar215,auVar146);
            fVar173 = auVar19._0_4_;
            fVar178 = auVar19._4_4_;
            auVar57._4_4_ = auVar107._4_4_ * fVar178;
            auVar57._0_4_ = auVar107._0_4_ * fVar173;
            fVar179 = auVar19._8_4_;
            auVar57._8_4_ = auVar107._8_4_ * fVar179;
            fVar180 = auVar19._12_4_;
            auVar57._12_4_ = auVar107._12_4_ * fVar180;
            auVar57._16_4_ = auVar107._16_4_ * 0.0;
            auVar57._20_4_ = auVar107._20_4_ * 0.0;
            auVar57._24_4_ = auVar107._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar178 * -auVar199._4_4_;
            auVar58._0_4_ = fVar173 * -auVar199._0_4_;
            auVar58._8_4_ = fVar179 * -auVar199._8_4_;
            auVar58._12_4_ = fVar180 * -auVar199._12_4_;
            auVar58._16_4_ = -auVar199._16_4_ * 0.0;
            auVar58._20_4_ = -auVar199._20_4_ * 0.0;
            auVar58._24_4_ = -auVar199._24_4_ * 0.0;
            auVar58._28_4_ = auVar146._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar178 * 0.0,fVar173 * 0.0))));
            auVar19 = vfmadd213ps_fma(auVar53,_local_400,local_580);
            auVar97 = vfmadd213ps_fma(auVar54,_local_400,local_520);
            auVar96 = vfmadd213ps_fma(auVar55,_local_400,ZEXT1632(auVar16));
            auVar117 = vfnmadd213ps_fma(auVar53,_local_400,local_580);
            auVar130 = vfmadd213ps_fma(auVar57,auVar208,local_2e0);
            auVar142 = vfnmadd213ps_fma(auVar54,_local_400,local_520);
            auVar116 = vfmadd213ps_fma(auVar58,auVar208,auVar108);
            auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar16),_local_400,auVar55);
            auVar16 = vfmadd213ps_fma(auVar59,auVar208,ZEXT1632(auVar14));
            auVar148 = vfnmadd213ps_fma(auVar57,auVar208,local_2e0);
            auVar94 = vfnmadd213ps_fma(auVar58,auVar208,auVar108);
            auVar147 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar208,auVar59);
            auVar146 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar142));
            auVar199 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar115));
            auVar60._4_4_ = auVar146._4_4_ * auVar115._4_4_;
            auVar60._0_4_ = auVar146._0_4_ * auVar115._0_4_;
            auVar60._8_4_ = auVar146._8_4_ * auVar115._8_4_;
            auVar60._12_4_ = auVar146._12_4_ * auVar115._12_4_;
            auVar60._16_4_ = auVar146._16_4_ * 0.0;
            auVar60._20_4_ = auVar146._20_4_ * 0.0;
            auVar60._24_4_ = auVar146._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar142),auVar199);
            auVar61._4_4_ = auVar117._4_4_ * auVar199._4_4_;
            auVar61._0_4_ = auVar117._0_4_ * auVar199._0_4_;
            auVar61._8_4_ = auVar117._8_4_ * auVar199._8_4_;
            auVar61._12_4_ = auVar117._12_4_ * auVar199._12_4_;
            auVar61._16_4_ = auVar199._16_4_ * 0.0;
            auVar61._20_4_ = auVar199._20_4_ * 0.0;
            auVar61._24_4_ = auVar199._24_4_ * 0.0;
            auVar61._28_4_ = auVar199._28_4_;
            auVar186 = ZEXT1632(auVar117);
            auVar199 = vsubps_avx(ZEXT1632(auVar130),auVar186);
            auVar108 = ZEXT1632(auVar115);
            auVar14 = vfmsub231ps_fma(auVar61,auVar108,auVar199);
            auVar62._4_4_ = auVar142._4_4_ * auVar199._4_4_;
            auVar62._0_4_ = auVar142._0_4_ * auVar199._0_4_;
            auVar62._8_4_ = auVar142._8_4_ * auVar199._8_4_;
            auVar62._12_4_ = auVar142._12_4_ * auVar199._12_4_;
            auVar62._16_4_ = auVar199._16_4_ * 0.0;
            auVar62._20_4_ = auVar199._20_4_ * 0.0;
            auVar62._24_4_ = auVar199._24_4_ * 0.0;
            auVar62._28_4_ = auVar199._28_4_;
            auVar117 = vfmsub231ps_fma(auVar62,auVar186,auVar146);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar95));
            auVar101 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar146 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar19),auVar101);
            auVar199 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar97),auVar101);
            auVar107 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar96),auVar101);
            auVar140 = vblendvps_avx(auVar186,ZEXT1632(auVar130),auVar101);
            auVar99 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar116),auVar101);
            auVar166 = vblendvps_avx(auVar108,ZEXT1632(auVar16),auVar101);
            auVar186 = vblendvps_avx(ZEXT1632(auVar130),auVar186,auVar101);
            auVar160 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar142),auVar101);
            auVar14 = vpackssdw_avx(local_420._0_16_,local_420._16_16_);
            auVar108 = vblendvps_avx(ZEXT1632(auVar16),auVar108,auVar101);
            auVar186 = vsubps_avx(auVar186,auVar146);
            auVar160 = vsubps_avx(auVar160,auVar199);
            auVar20 = vsubps_avx(auVar108,auVar107);
            auVar206 = ZEXT3264(auVar20);
            auVar21 = vsubps_avx(auVar146,auVar140);
            auVar22 = vsubps_avx(auVar199,auVar99);
            auVar100 = vsubps_avx(auVar107,auVar166);
            auVar161._0_4_ = auVar20._0_4_ * auVar146._0_4_;
            auVar161._4_4_ = auVar20._4_4_ * auVar146._4_4_;
            auVar161._8_4_ = auVar20._8_4_ * auVar146._8_4_;
            auVar161._12_4_ = auVar20._12_4_ * auVar146._12_4_;
            auVar161._16_4_ = auVar20._16_4_ * auVar146._16_4_;
            auVar161._20_4_ = auVar20._20_4_ * auVar146._20_4_;
            auVar161._24_4_ = auVar20._24_4_ * auVar146._24_4_;
            auVar161._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar161,auVar107,auVar186);
            auVar63._4_4_ = auVar186._4_4_ * auVar199._4_4_;
            auVar63._0_4_ = auVar186._0_4_ * auVar199._0_4_;
            auVar63._8_4_ = auVar186._8_4_ * auVar199._8_4_;
            auVar63._12_4_ = auVar186._12_4_ * auVar199._12_4_;
            auVar63._16_4_ = auVar186._16_4_ * auVar199._16_4_;
            auVar63._20_4_ = auVar186._20_4_ * auVar199._20_4_;
            auVar63._24_4_ = auVar186._24_4_ * auVar199._24_4_;
            auVar63._28_4_ = auVar108._28_4_;
            auVar19 = vfmsub231ps_fma(auVar63,auVar146,auVar160);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar16),_DAT_01faff00);
            auVar162._0_4_ = auVar160._0_4_ * auVar107._0_4_;
            auVar162._4_4_ = auVar160._4_4_ * auVar107._4_4_;
            auVar162._8_4_ = auVar160._8_4_ * auVar107._8_4_;
            auVar162._12_4_ = auVar160._12_4_ * auVar107._12_4_;
            auVar162._16_4_ = auVar160._16_4_ * auVar107._16_4_;
            auVar162._20_4_ = auVar160._20_4_ * auVar107._20_4_;
            auVar162._24_4_ = auVar160._24_4_ * auVar107._24_4_;
            auVar162._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar162,auVar199,auVar20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar163._0_4_ = auVar100._0_4_ * auVar140._0_4_;
            auVar163._4_4_ = auVar100._4_4_ * auVar140._4_4_;
            auVar163._8_4_ = auVar100._8_4_ * auVar140._8_4_;
            auVar163._12_4_ = auVar100._12_4_ * auVar140._12_4_;
            auVar163._16_4_ = auVar100._16_4_ * auVar140._16_4_;
            auVar163._20_4_ = auVar100._20_4_ * auVar140._20_4_;
            auVar163._24_4_ = auVar100._24_4_ * auVar140._24_4_;
            auVar163._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar163,auVar21,auVar166);
            auVar64._4_4_ = auVar22._4_4_ * auVar166._4_4_;
            auVar64._0_4_ = auVar22._0_4_ * auVar166._0_4_;
            auVar64._8_4_ = auVar22._8_4_ * auVar166._8_4_;
            auVar64._12_4_ = auVar22._12_4_ * auVar166._12_4_;
            auVar64._16_4_ = auVar22._16_4_ * auVar166._16_4_;
            auVar64._20_4_ = auVar22._20_4_ * auVar166._20_4_;
            auVar64._24_4_ = auVar22._24_4_ * auVar166._24_4_;
            auVar64._28_4_ = auVar166._28_4_;
            auVar96 = vfmsub231ps_fma(auVar64,auVar99,auVar100);
            auVar65._4_4_ = auVar21._4_4_ * auVar99._4_4_;
            auVar65._0_4_ = auVar21._0_4_ * auVar99._0_4_;
            auVar65._8_4_ = auVar21._8_4_ * auVar99._8_4_;
            auVar65._12_4_ = auVar21._12_4_ * auVar99._12_4_;
            auVar65._16_4_ = auVar21._16_4_ * auVar99._16_4_;
            auVar65._20_4_ = auVar21._20_4_ * auVar99._20_4_;
            auVar65._24_4_ = auVar21._24_4_ * auVar99._24_4_;
            auVar65._28_4_ = auVar99._28_4_;
            auVar130 = vfmsub231ps_fma(auVar65,auVar22,auVar140);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar130),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
            auVar140 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar96));
            auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
            auVar16 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
            auVar14 = vpand_avx(auVar14,auVar16);
            auVar140 = vpmovsxwd_avx2(auVar14);
            if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar140 >> 0x7f,0) == '\0') &&
                  (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0xbf,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar140[0x1f]) {
LAB_0161c10c:
              auVar177 = ZEXT3264(CONCAT824(uStack_528,
                                            CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
              auVar187 = ZEXT3264(auVar182);
            }
            else {
              auVar66._4_4_ = auVar160._4_4_ * auVar100._4_4_;
              auVar66._0_4_ = auVar160._0_4_ * auVar100._0_4_;
              auVar66._8_4_ = auVar160._8_4_ * auVar100._8_4_;
              auVar66._12_4_ = auVar160._12_4_ * auVar100._12_4_;
              auVar66._16_4_ = auVar160._16_4_ * auVar100._16_4_;
              auVar66._20_4_ = auVar160._20_4_ * auVar100._20_4_;
              auVar66._24_4_ = auVar160._24_4_ * auVar100._24_4_;
              auVar66._28_4_ = auVar140._28_4_;
              auVar95 = vfmsub231ps_fma(auVar66,auVar22,auVar20);
              auVar169._0_4_ = auVar20._0_4_ * auVar21._0_4_;
              auVar169._4_4_ = auVar20._4_4_ * auVar21._4_4_;
              auVar169._8_4_ = auVar20._8_4_ * auVar21._8_4_;
              auVar169._12_4_ = auVar20._12_4_ * auVar21._12_4_;
              auVar169._16_4_ = auVar20._16_4_ * auVar21._16_4_;
              auVar169._20_4_ = auVar20._20_4_ * auVar21._20_4_;
              auVar169._24_4_ = auVar20._24_4_ * auVar21._24_4_;
              auVar169._28_4_ = 0;
              auVar116 = vfmsub231ps_fma(auVar169,auVar186,auVar100);
              auVar67._4_4_ = auVar186._4_4_ * auVar22._4_4_;
              auVar67._0_4_ = auVar186._0_4_ * auVar22._0_4_;
              auVar67._8_4_ = auVar186._8_4_ * auVar22._8_4_;
              auVar67._12_4_ = auVar186._12_4_ * auVar22._12_4_;
              auVar67._16_4_ = auVar186._16_4_ * auVar22._16_4_;
              auVar67._20_4_ = auVar186._20_4_ * auVar22._20_4_;
              auVar67._24_4_ = auVar186._24_4_ * auVar22._24_4_;
              auVar67._28_4_ = auVar22._28_4_;
              auVar117 = vfmsub231ps_fma(auVar67,auVar21,auVar160);
              auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar116),ZEXT1632(auVar117));
              auVar130 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar95),ZEXT832(0) << 0x20);
              auVar140 = vrcpps_avx(ZEXT1632(auVar130));
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = 0x3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar206 = ZEXT3264(auVar204);
              auVar16 = vfnmadd213ps_fma(auVar140,ZEXT1632(auVar130),auVar204);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar140,auVar140);
              auVar144._0_4_ = auVar117._0_4_ * auVar107._0_4_;
              auVar144._4_4_ = auVar117._4_4_ * auVar107._4_4_;
              auVar144._8_4_ = auVar117._8_4_ * auVar107._8_4_;
              auVar144._12_4_ = auVar117._12_4_ * auVar107._12_4_;
              auVar144._16_4_ = auVar107._16_4_ * 0.0;
              auVar144._20_4_ = auVar107._20_4_ * 0.0;
              auVar144._24_4_ = auVar107._24_4_ * 0.0;
              auVar144._28_4_ = 0;
              auVar116 = vfmadd231ps_fma(auVar144,ZEXT1632(auVar116),auVar199);
              auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar146,ZEXT1632(auVar95));
              fVar173 = auVar16._0_4_;
              fVar178 = auVar16._4_4_;
              fVar179 = auVar16._8_4_;
              fVar180 = auVar16._12_4_;
              auVar107 = ZEXT1632(CONCAT412(fVar180 * auVar116._12_4_,
                                            CONCAT48(fVar179 * auVar116._8_4_,
                                                     CONCAT44(fVar178 * auVar116._4_4_,
                                                              fVar173 * auVar116._0_4_))));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar145._4_4_ = uVar8;
              auVar145._0_4_ = uVar8;
              auVar145._8_4_ = uVar8;
              auVar145._12_4_ = uVar8;
              auVar145._16_4_ = uVar8;
              auVar145._20_4_ = uVar8;
              auVar145._24_4_ = uVar8;
              auVar145._28_4_ = uVar8;
              auVar79._4_4_ = uStack_fc;
              auVar79._0_4_ = local_100;
              auVar79._8_4_ = uStack_f8;
              auVar79._12_4_ = uStack_f4;
              auVar79._16_4_ = uStack_f0;
              auVar79._20_4_ = uStack_ec;
              auVar79._24_4_ = uStack_e8;
              auVar79._28_4_ = uStack_e4;
              auVar146 = vcmpps_avx(auVar79,auVar107,2);
              auVar199 = vcmpps_avx(auVar107,auVar145,2);
              auVar146 = vandps_avx(auVar199,auVar146);
              auVar16 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
              auVar14 = vpand_avx(auVar14,auVar16);
              auVar146 = vpmovsxwd_avx2(auVar14);
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar146 >> 0x7f,0) == '\0') &&
                    (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0xbf,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar146[0x1f]) goto LAB_0161c10c;
              auVar146 = vcmpps_avx(ZEXT1632(auVar130),ZEXT832(0) << 0x20,4);
              auVar16 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
              auVar14 = vpand_avx(auVar14,auVar16);
              auVar146 = vpmovsxwd_avx2(auVar14);
              auVar177 = ZEXT3264(CONCAT824(uStack_528,
                                            CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
              auVar187 = ZEXT3264(auVar182);
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                auVar140 = ZEXT1632(CONCAT412(fVar180 * auVar19._12_4_,
                                              CONCAT48(fVar179 * auVar19._8_4_,
                                                       CONCAT44(fVar178 * auVar19._4_4_,
                                                                fVar173 * auVar19._0_4_))));
                auVar68._28_4_ = SUB84(uStack_528,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar180 * auVar96._12_4_,
                                        CONCAT48(fVar179 * auVar96._8_4_,
                                                 CONCAT44(fVar178 * auVar96._4_4_,
                                                          fVar173 * auVar96._0_4_))));
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar199 = vsubps_avx(auVar176,auVar140);
                local_5e0 = vblendvps_avx(auVar199,auVar140,auVar101);
                auVar199 = vsubps_avx(auVar176,auVar68);
                local_340 = vblendvps_avx(auVar199,auVar68,auVar101);
                auVar177 = ZEXT3264(auVar146);
                auVar187 = ZEXT3264(auVar107);
              }
            }
            auVar200 = ZEXT3264(local_700);
            auVar146 = auVar177._0_32_;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar177[0x1f]) goto LAB_0161bb6d;
            auVar199 = vsubps_avx(auVar208,_local_400);
            auVar14 = vfmadd213ps_fma(auVar199,local_5e0,_local_400);
            fVar173 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar69._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar173;
            auVar69._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar173;
            auVar69._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar173;
            auVar69._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar173;
            auVar69._16_4_ = fVar173 * 0.0;
            auVar69._20_4_ = fVar173 * 0.0;
            auVar69._24_4_ = fVar173 * 0.0;
            auVar69._28_4_ = fVar173;
            auVar140 = auVar187._0_32_;
            auVar199 = vcmpps_avx(auVar140,auVar69,6);
            auVar107 = auVar146 & auVar199;
            auVar177 = ZEXT3264(local_6e0);
            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar107 >> 0x7f,0) == '\0') &&
                  (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0xbf,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar107[0x1f]) {
              auVar128 = ZEXT3264(local_5e0);
            }
            else {
              auVar127._8_4_ = 0xbf800000;
              auVar127._0_8_ = 0xbf800000bf800000;
              auVar127._12_4_ = 0xbf800000;
              auVar127._16_4_ = 0xbf800000;
              auVar127._20_4_ = 0xbf800000;
              auVar127._24_4_ = 0xbf800000;
              auVar127._28_4_ = 0xbf800000;
              auVar141._8_4_ = 0x40000000;
              auVar141._0_8_ = 0x4000000040000000;
              auVar141._12_4_ = 0x40000000;
              auVar141._16_4_ = 0x40000000;
              auVar141._20_4_ = 0x40000000;
              auVar141._24_4_ = 0x40000000;
              auVar141._28_4_ = 0x40000000;
              auVar14 = vfmadd213ps_fma(local_340,auVar141,auVar127);
              local_260 = local_5e0;
              local_240 = ZEXT1632(auVar14);
              local_1f0 = local_690;
              uStack_1e8 = uStack_688;
              local_1e0 = local_6a0;
              uStack_1d8 = uStack_698;
              local_1d0 = local_6b0;
              uStack_1c8 = uStack_6a8;
              pGVar89 = (context->scene->geometries).items[local_708].ptr;
              auVar128 = ZEXT3264(local_5e0);
              local_340 = local_240;
              if ((pGVar89->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar82 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar82 = 1, pGVar89->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_680 = ZEXT1632(CONCAT88(auVar17._8_8_,pGVar89));
                auVar146 = vandps_avx(auVar199,auVar146);
                auVar206 = ZEXT1264(ZEXT812(0));
                fVar129 = (float)local_200;
                local_180[0] = (fVar129 + local_5e0._0_4_ + 0.0) * local_120;
                local_180[1] = (fVar129 + local_5e0._4_4_ + 1.0) * fStack_11c;
                local_180[2] = (fVar129 + local_5e0._8_4_ + 2.0) * fStack_118;
                local_180[3] = (fVar129 + local_5e0._12_4_ + 3.0) * fStack_114;
                fStack_170 = (fVar129 + local_5e0._16_4_ + 4.0) * fStack_110;
                fStack_16c = (fVar129 + local_5e0._20_4_ + 5.0) * fStack_10c;
                fStack_168 = (fVar129 + local_5e0._24_4_ + 6.0) * fStack_108;
                fStack_164 = fVar129 + local_5e0._28_4_ + 7.0;
                local_340._0_8_ = auVar14._0_8_;
                local_340._8_8_ = auVar14._8_8_;
                local_160 = local_340._0_8_;
                uStack_158 = local_340._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_140 = auVar140;
                uVar85 = vmovmskps_avx(auVar146);
                if (uVar85 == 0) {
                  bVar82 = 0;
LAB_0161c153:
                  auVar200 = ZEXT3264(local_700);
                  auVar128 = ZEXT3264(local_5e0);
                  auVar187 = ZEXT3264(auVar140);
                  auVar177 = ZEXT3264(local_6e0);
                  fVar129 = (float)local_660;
                  fVar109 = local_660._4_4_;
                  fVar110 = (float)uStack_658;
                  fVar111 = uStack_658._4_4_;
                  fVar112 = (float)uStack_650;
                  fVar113 = uStack_650._4_4_;
                  fVar114 = (float)uStack_648;
                  uVar196 = uStack_648._4_4_;
                }
                else {
                  uVar86 = (ulong)(uVar85 & 0xff);
                  local_800 = ZEXT1632(CONCAT88(auVar97._8_8_,uVar86));
                  local_840 = 0;
                  for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
                    local_840 = local_840 + 1;
                  }
                  local_520 = ZEXT1632(*local_638);
                  local_600 = ZEXT1632(CONCAT124(auVar18._4_12_,*(undefined4 *)(ray + k * 4 + 0x80))
                                      );
                  local_220 = auVar140;
                  local_1fc = iVar12;
                  do {
                    fVar129 = local_180[local_840];
                    local_3a0._4_4_ = fVar129;
                    local_3a0._0_4_ = fVar129;
                    local_3a0._8_4_ = fVar129;
                    local_3a0._12_4_ = fVar129;
                    local_390 = *(undefined4 *)((long)&local_160 + local_840 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + local_840 * 4)
                    ;
                    fVar109 = 1.0 - fVar129;
                    auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3a0,
                                              ZEXT416(0xc0a00000));
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * 3.0)),
                                              ZEXT416((uint)(fVar129 + fVar129)),auVar14);
                    auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3a0,
                                              ZEXT416(0x40000000));
                    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar109 * fVar109 * -3.0)),
                                              ZEXT416((uint)(fVar109 + fVar109)),auVar14);
                    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar129 * (fVar109 + fVar109))),
                                               ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),local_3a0,
                                              ZEXT416((uint)(fVar109 * -2.0)));
                    fVar129 = auVar14._0_4_ * 0.5;
                    fVar109 = auVar17._0_4_ * 0.5;
                    auVar152._0_4_ = fVar109 * local_5b0;
                    auVar152._4_4_ = fVar109 * fStack_5ac;
                    auVar152._8_4_ = fVar109 * fStack_5a8;
                    auVar152._12_4_ = fVar109 * fStack_5a4;
                    auVar134._4_4_ = fVar129;
                    auVar134._0_4_ = fVar129;
                    auVar134._8_4_ = fVar129;
                    auVar134._12_4_ = fVar129;
                    auVar72._8_8_ = uStack_6a8;
                    auVar72._0_8_ = local_6b0;
                    auVar14 = vfmadd132ps_fma(auVar134,auVar152,auVar72);
                    fVar129 = auVar16._0_4_ * 0.5;
                    auVar153._4_4_ = fVar129;
                    auVar153._0_4_ = fVar129;
                    auVar153._8_4_ = fVar129;
                    auVar153._12_4_ = fVar129;
                    auVar74._8_8_ = uStack_698;
                    auVar74._0_8_ = local_6a0;
                    auVar14 = vfmadd132ps_fma(auVar153,auVar14,auVar74);
                    local_630.context = context->user;
                    fVar129 = auVar18._0_4_ * 0.5;
                    auVar135._4_4_ = fVar129;
                    auVar135._0_4_ = fVar129;
                    auVar135._8_4_ = fVar129;
                    auVar135._12_4_ = fVar129;
                    auVar76._8_8_ = uStack_688;
                    auVar76._0_8_ = local_690;
                    auVar14 = vfmadd132ps_fma(auVar135,auVar14,auVar76);
                    local_3d0 = auVar14._0_4_;
                    local_3c0 = vshufps_avx(auVar14,auVar14,0x55);
                    local_3b0 = vshufps_avx(auVar14,auVar14,0xaa);
                    uStack_378 = CONCAT44(uStack_5b4,uStack_5b8);
                    local_380 = local_5c0;
                    local_370._4_4_ = uStack_2ac;
                    local_370._0_4_ = local_2b0;
                    local_370._8_4_ = uStack_2a8;
                    local_370._12_4_ = uStack_2a4;
                    vpcmpeqd_avx2(ZEXT1632(local_370),ZEXT1632(local_370));
                    uStack_35c = (local_630.context)->instID[0];
                    local_360 = uStack_35c;
                    uStack_358 = uStack_35c;
                    uStack_354 = uStack_35c;
                    uStack_350 = (local_630.context)->instPrimID[0];
                    uStack_34c = uStack_350;
                    uStack_348 = uStack_350;
                    uStack_344 = uStack_350;
                    local_720 = local_520._0_16_;
                    local_630.valid = (int *)local_720;
                    local_630.geometryUserPtr = pGVar89->userPtr;
                    local_630.hit = (RTCHitN *)&local_3d0;
                    local_630.N = 4;
                    local_630.ray = (RTCRayN *)ray;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    uStack_38c = local_390;
                    uStack_388 = local_390;
                    uStack_384 = local_390;
                    if (pGVar89->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar206 = ZEXT1664(auVar206._0_16_);
                      (*pGVar89->occlusionFilterN)(&local_630);
                    }
                    if (local_720 == (undefined1  [16])0x0) {
                      auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar14 = auVar14 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_680._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (*p_Var13)(&local_630);
                      }
                      auVar16 = vpcmpeqd_avx(local_720,_DAT_01f7aa10);
                      auVar14 = auVar16 ^ _DAT_01f7ae20;
                      auVar136._8_4_ = 0xff800000;
                      auVar136._0_8_ = 0xff800000ff800000;
                      auVar136._12_4_ = 0xff800000;
                      auVar16 = vblendvps_avx(auVar136,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                              auVar16);
                      *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar16;
                    }
                    auVar119._8_8_ = 0x100000001;
                    auVar119._0_8_ = 0x100000001;
                    if ((auVar119 & auVar14) != (undefined1  [16])0x0) {
                      bVar82 = 1;
                      goto LAB_0161c153;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_600._0_4_;
                    uVar87 = local_800._0_8_ ^ 1L << (local_840 & 0x3f);
                    bVar82 = 0;
                    local_800._0_8_ = uVar87;
                    local_840 = 0;
                    for (uVar86 = uVar87; (uVar86 & 1) == 0;
                        uVar86 = uVar86 >> 1 | 0x8000000000000000) {
                      local_840 = local_840 + 1;
                    }
                    auVar200 = ZEXT3264(local_700);
                    auVar128 = ZEXT3264(local_5e0);
                    auVar187 = ZEXT3264(auVar140);
                    auVar177 = ZEXT3264(local_6e0);
                    pGVar89 = (Geometry *)local_680._0_8_;
                    fVar129 = (float)local_660;
                    fVar109 = local_660._4_4_;
                    fVar110 = (float)uStack_658;
                    fVar111 = uStack_658._4_4_;
                    fVar112 = (float)uStack_650;
                    fVar113 = uStack_650._4_4_;
                    fVar114 = (float)uStack_648;
                    uVar196 = uStack_648._4_4_;
                  } while (uVar87 != 0);
                }
              }
              bVar84 = (bool)(bVar84 | bVar82);
            }
          }
          local_5e0 = auVar128._0_32_;
          lVar90 = lVar90 + 8;
        } while ((int)lVar90 < iVar12);
      }
      if (bVar84) {
        return bVar84;
      }
      uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar98._4_4_ = uVar92;
      auVar98._0_4_ = uVar92;
      auVar98._8_4_ = uVar92;
      auVar98._12_4_ = uVar92;
      auVar14 = vcmpps_avx(local_2a0,auVar98,2);
      uVar85 = vmovmskps_avx(auVar14);
      uVar85 = (uint)uVar91 & uVar85;
    } while (uVar85 != 0);
  }
  return bVar84;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }